

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  int iVar97;
  undefined4 uVar98;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vint4 bi;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  vfloat4 a0;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 ai;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vint4 ai_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar168;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar170;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  vfloat4 a0_3;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar211;
  float fVar212;
  vfloat4 b0_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  vfloat4 a0_4;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  __m128 a_2;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar249 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  long local_260;
  ulong local_258;
  Primitive *local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_17c;
  undefined4 local_174;
  undefined4 local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar234 [32];
  
  uVar24 = (ulong)(byte)prim[1];
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  lVar28 = uVar24 * 0x25;
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xf + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x11 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1a + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1b + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1c + 6)));
  auVar83._16_16_ = in_YmmResult._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar28 + 0x12)));
  auVar38 = vsubps_avx512vl((undefined1  [16])(ray->org).field_0,
                            *(undefined1 (*) [16])(prim + lVar28 + 6));
  fVar216 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar58 = vpmovsxwd_avx(auVar55);
  auVar39 = vpbroadcastd_avx512vl();
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar24 * 0xb + 6);
  auVar40 = vpmovsxwd_avx512vl(auVar53);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar41 = vpmovsxwd_avx512vl(auVar57);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar24 * 0xd + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar60);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar24 * 0x12 + 6);
  auVar59 = vpmovsxwd_avx(auVar54);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar24 * 0x16 + 6);
  auVar61 = vpmovsxwd_avx(auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar24 * 0x14 + 6);
  auVar62 = vpmovsxwd_avx(auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar24 * 0x18 + 6);
  auVar63 = vpmovsxwd_avx(auVar63);
  auVar38 = vmulps_avx512vl(auVar37,auVar38);
  auVar37 = vmulps_avx512vl(auVar37,(undefined1  [16])(ray->dir).field_0);
  auVar43 = vcvtdq2ps_avx512vl(auVar47);
  auVar44 = vcvtdq2ps_avx512vl(auVar44);
  auVar45 = vcvtdq2ps_avx512vl(auVar45);
  auVar46 = vcvtdq2ps_avx512vl(auVar46);
  auVar244 = ZEXT1664(auVar46);
  auVar55 = vcvtdq2ps_avx(auVar48);
  auVar53 = vcvtdq2ps_avx(auVar49);
  auVar57 = vcvtdq2ps_avx(auVar50);
  auVar60 = vcvtdq2ps_avx(auVar51);
  auVar54 = vcvtdq2ps_avx(auVar52);
  auVar47 = vbroadcastss_avx512vl(auVar37);
  auVar48 = vshufps_avx512vl(auVar37,auVar37,0x55);
  auVar49 = vshufps_avx512vl(auVar37,auVar37,0xaa);
  auVar50 = vmulps_avx512vl(auVar49,auVar45);
  auVar37._0_4_ = auVar49._0_4_ * auVar53._0_4_;
  auVar37._4_4_ = auVar49._4_4_ * auVar53._4_4_;
  auVar37._8_4_ = auVar49._8_4_ * auVar53._8_4_;
  auVar37._12_4_ = auVar49._12_4_ * auVar53._12_4_;
  auVar52._0_4_ = auVar54._0_4_ * auVar49._0_4_;
  auVar52._4_4_ = auVar54._4_4_ * auVar49._4_4_;
  auVar52._8_4_ = auVar54._8_4_ * auVar49._8_4_;
  auVar52._12_4_ = auVar54._12_4_ * auVar49._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar44);
  auVar50 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar55);
  auVar48 = vfmadd231ps_avx512vl(auVar52,auVar60,auVar48);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar43);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar46);
  auVar47 = vfmadd231ps_fma(auVar48,auVar57,auVar47);
  auVar48 = vbroadcastss_avx512vl(auVar38);
  auVar51 = vshufps_avx512vl(auVar38,auVar38,0x55);
  auVar241 = ZEXT1664(auVar51);
  auVar52 = vshufps_avx512vl(auVar38,auVar38,0xaa);
  auVar45 = vmulps_avx512vl(auVar52,auVar45);
  auVar53 = vmulps_avx512vl(auVar52,auVar53);
  auVar54 = vmulps_avx512vl(auVar52,auVar54);
  auVar44 = vfmadd231ps_avx512vl(auVar45,auVar51,auVar44);
  auVar55 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar55);
  auVar53 = vfmadd231ps_avx512vl(auVar54,auVar51,auVar60);
  auVar52 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar43);
  auVar37 = vfmadd231ps_avx512vl(auVar55,auVar48,auVar46);
  auVar51 = vfmadd231ps_fma(auVar53,auVar48,auVar57);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar246 = ZEXT1664(auVar55);
  auVar53 = vandps_avx512vl(auVar49,auVar55);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar53,auVar171,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar38._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar49._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar49._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar49._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar49._12_4_;
  auVar53 = vandps_avx512vl(auVar50,auVar55);
  uVar31 = vcmpps_avx512vl(auVar53,auVar171,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar43._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar50._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar50._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar50._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar50._12_4_;
  auVar55 = vandps_avx512vl(auVar47,auVar55);
  uVar31 = vcmpps_avx512vl(auVar55,auVar171,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar56._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar47._12_4_;
  auVar55 = vrcp14ps_avx512vl(auVar38);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar247 = ZEXT1664(auVar53);
  auVar57 = vfnmadd213ps_avx512vl(auVar38,auVar55,auVar53);
  auVar60 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar43);
  auVar57 = vfnmadd213ps_avx512vl(auVar43,auVar55,auVar53);
  auVar54 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar56);
  auVar53 = vfnmadd213ps_avx512vl(auVar56,auVar55,auVar53);
  auVar48 = vfmadd132ps_fma(auVar53,auVar55,auVar55);
  auVar129._4_4_ = fVar216;
  auVar129._0_4_ = fVar216;
  auVar129._8_4_ = fVar216;
  auVar129._12_4_ = fVar216;
  auVar55 = vcvtdq2ps_avx(auVar58);
  auVar53 = vcvtdq2ps_avx512vl(auVar40);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar49 = vfmadd213ps_fma(auVar53,auVar129,auVar55);
  auVar53 = vcvtdq2ps_avx512vl(auVar41);
  auVar55 = vcvtdq2ps_avx512vl(auVar42);
  auVar55 = vsubps_avx(auVar55,auVar53);
  auVar50 = vfmadd213ps_fma(auVar55,auVar129,auVar53);
  auVar55 = vcvtdq2ps_avx(auVar59);
  auVar53 = vcvtdq2ps_avx(auVar61);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar61 = vfmadd213ps_fma(auVar53,auVar129,auVar55);
  auVar55 = vcvtdq2ps_avx(auVar62);
  auVar53 = vcvtdq2ps_avx(auVar63);
  auVar57 = vsubps_avx(auVar53,auVar55);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar24 * 0x1d + 6);
  auVar53 = vpmovsxwd_avx(auVar47);
  auVar57 = vfmadd213ps_fma(auVar57,auVar129,auVar55);
  auVar55 = vcvtdq2ps_avx(auVar53);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar24 * 0x21 + 6);
  auVar53 = vpmovsxwd_avx(auVar44);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar62 = vfmadd213ps_fma(auVar53,auVar129,auVar55);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar24 * 0x1f + 6);
  auVar55 = vpmovsxwd_avx(auVar45);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar24 * 0x23 + 6);
  auVar53 = vpmovsxwd_avx(auVar46);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar55);
  auVar53 = vfmadd213ps_fma(auVar53,auVar129,auVar55);
  auVar55 = vsubps_avx512vl(auVar49,auVar52);
  auVar41._0_4_ = auVar60._0_4_ * auVar55._0_4_;
  auVar41._4_4_ = auVar60._4_4_ * auVar55._4_4_;
  auVar41._8_4_ = auVar60._8_4_ * auVar55._8_4_;
  auVar41._12_4_ = auVar60._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar50,auVar52);
  auVar40._0_4_ = auVar60._0_4_ * auVar55._0_4_;
  auVar40._4_4_ = auVar60._4_4_ * auVar55._4_4_;
  auVar40._8_4_ = auVar60._8_4_ * auVar55._8_4_;
  auVar40._12_4_ = auVar60._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar61,auVar37);
  auVar42._0_4_ = auVar54._0_4_ * auVar55._0_4_;
  auVar42._4_4_ = auVar54._4_4_ * auVar55._4_4_;
  auVar42._8_4_ = auVar54._8_4_ * auVar55._8_4_;
  auVar42._12_4_ = auVar54._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar57,auVar37);
  auVar59._0_4_ = auVar54._0_4_ * auVar55._0_4_;
  auVar59._4_4_ = auVar54._4_4_ * auVar55._4_4_;
  auVar59._8_4_ = auVar54._8_4_ * auVar55._8_4_;
  auVar59._12_4_ = auVar54._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar62,auVar51);
  auVar160._0_4_ = auVar48._0_4_ * auVar55._0_4_;
  auVar160._4_4_ = auVar48._4_4_ * auVar55._4_4_;
  auVar160._8_4_ = auVar48._8_4_ * auVar55._8_4_;
  auVar160._12_4_ = auVar48._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar53,auVar51);
  auVar58._0_4_ = auVar48._0_4_ * auVar55._0_4_;
  auVar58._4_4_ = auVar48._4_4_ * auVar55._4_4_;
  auVar58._8_4_ = auVar48._8_4_ * auVar55._8_4_;
  auVar58._12_4_ = auVar48._12_4_ * auVar55._12_4_;
  auVar55 = vpminsd_avx(auVar41,auVar40);
  auVar53 = vpminsd_avx(auVar42,auVar59);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vpminsd_avx(auVar160,auVar58);
  uVar98 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar48._4_4_ = uVar98;
  auVar48._0_4_ = uVar98;
  auVar48._8_4_ = uVar98;
  auVar48._12_4_ = uVar98;
  auVar53 = vmaxps_avx512vl(auVar53,auVar48);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar49._8_4_ = 0x3f7ffffa;
  auVar49._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar49._12_4_ = 0x3f7ffffa;
  local_118 = vmulps_avx512vl(auVar55,auVar49);
  auVar55 = vpmaxsd_avx(auVar41,auVar40);
  auVar53 = vpmaxsd_avx(auVar42,auVar59);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vpmaxsd_avx(auVar160,auVar58);
  fVar216 = ray->tfar;
  auVar50._4_4_ = fVar216;
  auVar50._0_4_ = fVar216;
  auVar50._8_4_ = fVar216;
  auVar50._12_4_ = fVar216;
  auVar53 = vminps_avx512vl(auVar53,auVar50);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar51._8_4_ = 0x3f800003;
  auVar51._0_8_ = 0x3f8000033f800003;
  auVar51._12_4_ = 0x3f800003;
  auVar55 = vmulps_avx512vl(auVar55,auVar51);
  uVar13 = vcmpps_avx512vl(local_118,auVar55,2);
  uVar14 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar31 = (ulong)((byte)uVar13 & 0xf & (byte)uVar14);
  auVar55 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar249 = ZEXT1664(auVar55);
  auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar245 = ZEXT1664(auVar83._0_16_);
  local_250 = prim;
LAB_018b9e9f:
  if (uVar31 == 0) {
LAB_018bbc53:
    return uVar31 != 0;
  }
  lVar28 = 0;
  for (uVar24 = uVar31; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  local_300 = (ulong)*(uint *)(local_250 + 2);
  pGVar7 = (context->scene->geometries).items[local_300].ptr;
  fVar216 = (pGVar7->time_range).lower;
  fVar216 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar216) / ((pGVar7->time_range).upper - fVar216));
  auVar55 = vroundss_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),9);
  local_258 = (ulong)*(uint *)(local_250 + lVar28 * 4 + 6);
  auVar79._16_16_ = auVar83._16_16_;
  auVar53 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar55 = vminss_avx(auVar55,auVar53);
  auVar51 = vmaxss_avx512f(auVar249._0_16_,auVar55);
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_258 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar30 = (long)(int)auVar51._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar30);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar30);
  auVar55 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar24);
  lVar28 = uVar24 + 1;
  auVar53 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar28);
  lVar26 = uVar24 + 2;
  auVar57 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar26);
  lVar1 = uVar24 + 3;
  auVar60 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar30);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar30);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar26);
  auVar63 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar30);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar30);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
  auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
  auVar45 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar26);
  auVar46 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar30);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar30);
  auVar48 = *(undefined1 (*) [16])(lVar10 + uVar24 * lVar9);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar28 * lVar9);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar26 * lVar9);
  auVar51 = vsubss_avx512f(ZEXT416((uint)fVar216),auVar51);
  auVar79._0_16_ = vxorps_avx512vl(auVar244._0_16_,auVar244._0_16_);
  auVar52 = vmulps_avx512vl(auVar60,auVar79._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar79._0_16_);
  auVar58 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar53,auVar52);
  auVar58 = vaddps_avx512vl(auVar55,auVar58);
  auVar41 = auVar245._0_16_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar53,auVar41);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar55,auVar41);
  auVar59 = vmulps_avx512vl(auVar63,auVar79._0_16_);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar62,auVar79._0_16_);
  auVar37 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
  auVar37 = vfmadd213ps_avx512vl(auVar37,auVar61,auVar59);
  auVar38 = vaddps_avx512vl(auVar54,auVar37);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar61,auVar41);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar54,auVar41);
  auVar37 = vxorps_avx512vl(auVar37,auVar37);
  auVar37 = vfmadd213ps_avx512vl(auVar37,auVar57,auVar60);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar53,auVar79._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar55,auVar79._0_16_);
  auVar60 = vmulps_avx512vl(auVar60,auVar41);
  auVar57 = vfnmadd231ps_avx512vl(auVar60,auVar41,auVar57);
  auVar53 = vfmadd231ps_avx512vl(auVar57,auVar79._0_16_,auVar53);
  auVar39 = vfnmadd231ps_avx512vl(auVar53,auVar79._0_16_,auVar55);
  auVar55 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar62,auVar63);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar61,auVar79._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar79._0_16_);
  auVar55 = vmulps_avx512vl(auVar63,auVar41);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar41,auVar62);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar61);
  auVar61 = vfnmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar54);
  auVar53 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar55 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  auVar55 = vmulps_avx512vl(auVar52,auVar55);
  auVar55 = vfmsub231ps_avx512vl(auVar55,auVar53,auVar38);
  auVar57 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar55 = vmulps_avx512vl(auVar52,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar59);
  auVar60 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar145._0_4_ = auVar39._0_4_ * auVar53._0_4_;
  auVar145._4_4_ = auVar39._4_4_ * auVar53._4_4_;
  auVar145._8_4_ = auVar39._8_4_ * auVar53._8_4_;
  auVar145._12_4_ = auVar39._12_4_ * auVar53._12_4_;
  auVar53 = vfmsub231ps_fma(auVar145,auVar55,auVar40);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar146._0_4_ = auVar39._0_4_ * auVar53._0_4_;
  auVar146._4_4_ = auVar39._4_4_ * auVar53._4_4_;
  auVar146._8_4_ = auVar39._8_4_ * auVar53._8_4_;
  auVar146._12_4_ = auVar39._12_4_ * auVar53._12_4_;
  auVar55 = vfmsub231ps_fma(auVar146,auVar55,auVar61);
  auVar61 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar64._4_28_ = auVar79._4_28_;
  auVar64._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar62 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  auVar63 = vmulss_avx512f(auVar63,auVar53);
  auVar53 = vmulss_avx512f(auVar63,ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)));
  fVar211 = auVar62._0_4_ - auVar53._0_4_;
  auVar172._4_4_ = fVar211;
  auVar172._0_4_ = fVar211;
  auVar172._8_4_ = fVar211;
  auVar172._12_4_ = fVar211;
  auVar53 = vdpps_avx(auVar57,auVar60,0x7f);
  auVar62 = vmulps_avx512vl(auVar57,auVar172);
  auVar63 = vbroadcastss_avx512vl(auVar55);
  auVar60 = vmulps_avx512vl(auVar63,auVar60);
  fVar216 = auVar53._0_4_;
  auVar130._0_4_ = fVar216 * auVar57._0_4_;
  auVar130._4_4_ = fVar216 * auVar57._4_4_;
  auVar130._8_4_ = fVar216 * auVar57._8_4_;
  auVar130._12_4_ = fVar216 * auVar57._12_4_;
  auVar57 = vsubps_avx(auVar60,auVar130);
  auVar53 = vrcp14ss_avx512f(auVar79._0_16_,auVar64._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar53,ZEXT416(0x40000000));
  fVar216 = auVar53._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar82._16_16_ = auVar79._16_16_;
  auVar82._0_16_ = auVar79._0_16_;
  auVar65._4_28_ = auVar82._4_28_;
  auVar65._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar60 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar63 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  fVar200 = auVar53._0_4_;
  fVar212 = auVar60._0_4_ - auVar63._0_4_ * fVar200 * fVar200 * fVar200;
  auVar173._0_4_ = auVar54._0_4_ * fVar212;
  auVar173._4_4_ = auVar54._4_4_ * fVar212;
  auVar173._8_4_ = auVar54._8_4_ * fVar212;
  auVar173._12_4_ = auVar54._12_4_ * fVar212;
  auVar53 = vdpps_avx(auVar54,auVar61,0x7f);
  auVar60 = vbroadcastss_avx512vl(auVar55);
  auVar60 = vmulps_avx512vl(auVar60,auVar61);
  fVar200 = auVar53._0_4_;
  auVar107._0_4_ = fVar200 * auVar54._0_4_;
  auVar107._4_4_ = fVar200 * auVar54._4_4_;
  auVar107._8_4_ = fVar200 * auVar54._8_4_;
  auVar107._12_4_ = fVar200 * auVar54._12_4_;
  auVar53 = vsubps_avx(auVar60,auVar107);
  auVar60 = vrcp14ss_avx512f(auVar79._0_16_,auVar65._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar60,ZEXT416(0x40000000));
  fVar200 = auVar60._0_4_ * auVar55._0_4_;
  auVar55 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar60 = vmulps_avx512vl(auVar55,auVar62);
  auVar59 = vsubps_avx512vl(auVar58,auVar60);
  auVar54 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar62);
  auVar124._0_4_ = auVar54._0_4_ + auVar55._0_4_ * fVar211 * fVar216 * auVar57._0_4_;
  auVar124._4_4_ = auVar54._4_4_ + auVar55._4_4_ * fVar211 * fVar216 * auVar57._4_4_;
  auVar124._8_4_ = auVar54._8_4_ + auVar55._8_4_ * fVar211 * fVar216 * auVar57._8_4_;
  auVar124._12_4_ = auVar54._12_4_ + auVar55._12_4_ * fVar211 * fVar216 * auVar57._12_4_;
  auVar57 = vsubps_avx512vl(auVar52,auVar124);
  auVar58 = vaddps_avx512vl(auVar58,auVar60);
  auVar60 = vaddps_avx512vl(auVar52,auVar124);
  auVar55 = vshufps_avx512vl(auVar37,auVar37,0xff);
  auVar54 = vmulps_avx512vl(auVar55,auVar173);
  auVar52 = vsubps_avx512vl(auVar37,auVar54);
  auVar61 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar62 = vmulps_avx512vl(auVar61,auVar173);
  auVar174._0_4_ = auVar62._0_4_ + auVar55._0_4_ * fVar212 * auVar53._0_4_ * fVar200;
  auVar174._4_4_ = auVar62._4_4_ + auVar55._4_4_ * fVar212 * auVar53._4_4_ * fVar200;
  auVar174._8_4_ = auVar62._8_4_ + auVar55._8_4_ * fVar212 * auVar53._8_4_ * fVar200;
  auVar174._12_4_ = auVar62._12_4_ + auVar55._12_4_ * fVar212 * auVar53._12_4_ * fVar200;
  auVar55 = vsubps_avx(auVar39,auVar174);
  auVar37 = vaddps_avx512vl(auVar37,auVar54);
  auVar53 = vaddps_avx512vl(auVar39,auVar174);
  auVar99._8_4_ = 0x3eaaaaab;
  auVar99._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar99._12_4_ = 0x3eaaaaab;
  auVar161._0_4_ = auVar59._0_4_ + auVar57._0_4_ * 0.33333334;
  auVar161._4_4_ = auVar59._4_4_ + auVar57._4_4_ * 0.33333334;
  auVar161._8_4_ = auVar59._8_4_ + auVar57._8_4_ * 0.33333334;
  auVar161._12_4_ = auVar59._12_4_ + auVar57._12_4_ * 0.33333334;
  auVar147._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar147._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar147._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar147._12_4_ = auVar55._12_4_ * 0.33333334;
  auVar62 = vsubps_avx(auVar52,auVar147);
  local_318._4_4_ = auVar58._4_4_ + auVar60._4_4_ * 0.33333334;
  local_318._0_4_ = auVar58._0_4_ + auVar60._0_4_ * 0.33333334;
  fStack_310 = auVar58._8_4_ + auVar60._8_4_ * 0.33333334;
  fStack_30c = auVar58._12_4_ + auVar60._12_4_ * 0.33333334;
  auVar55 = vmulps_avx512vl(auVar53,auVar99);
  auVar63 = vsubps_avx(auVar37,auVar55);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
  auVar57 = vmulps_avx512vl(auVar46,auVar79._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar45,auVar79._0_16_);
  auVar53 = vxorps_avx512vl(auVar53,auVar53);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar44,auVar57);
  auVar38 = vaddps_avx512vl(auVar47,auVar53);
  auVar53 = vfmadd231ps_avx512vl(auVar57,auVar44,auVar41);
  auVar39 = vfnmadd231ps_avx512vl(auVar53,auVar47,auVar41);
  auVar53 = vmulps_avx512vl(auVar55,auVar79._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar50,auVar79._0_16_);
  auVar57 = vxorps_avx512vl(auVar61,auVar61);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar49,auVar53);
  auVar60 = vaddps_avx512vl(auVar48,auVar57);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar49,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar48,auVar41);
  auVar57 = vxorps_avx512vl(auVar57,auVar57);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar45,auVar46);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar44,auVar79._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar57,auVar47,auVar79._0_16_);
  auVar57 = vmulps_avx512vl(auVar46,auVar41);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar41,auVar45);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar79._0_16_,auVar44);
  auVar47 = vfnmadd231ps_avx512vl(auVar57,auVar79._0_16_,auVar47);
  auVar57 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar50,auVar55);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar49,auVar79._0_16_);
  auVar54 = vfmadd231ps_avx512vl(auVar57,auVar48,auVar79._0_16_);
  auVar55 = vmulps_avx512vl(auVar55,auVar41);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar41,auVar50);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar49);
  auVar61 = vfnmadd231ps_avx512vl(auVar55,auVar79._0_16_,auVar48);
  auVar55 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar57 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  fVar211 = auVar39._0_4_;
  auVar223._0_4_ = fVar211 * auVar57._0_4_;
  fVar212 = auVar39._4_4_;
  auVar223._4_4_ = fVar212 * auVar57._4_4_;
  fVar213 = auVar39._8_4_;
  auVar223._8_4_ = fVar213 * auVar57._8_4_;
  fVar214 = auVar39._12_4_;
  auVar223._12_4_ = fVar214 * auVar57._12_4_;
  auVar57 = vfmsub231ps_avx512vl(auVar223,auVar55,auVar60);
  auVar57 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar60 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar229._0_4_ = fVar211 * auVar60._0_4_;
  auVar229._4_4_ = fVar212 * auVar60._4_4_;
  auVar229._8_4_ = fVar213 * auVar60._8_4_;
  auVar229._12_4_ = fVar214 * auVar60._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar229,auVar55,auVar53);
  auVar60 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar53 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  auVar55 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar55 = vmulps_avx512vl(auVar47,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar54);
  auVar54 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar55 = vmulps_avx512vl(auVar47,auVar55);
  auVar55 = vfmsub231ps_fma(auVar55,auVar53,auVar61);
  auVar61 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vdpps_avx(auVar57,auVar57,0x7f);
  auVar66._16_16_ = auVar79._16_16_;
  auVar66._0_16_ = auVar79._0_16_;
  auVar67._4_28_ = auVar66._4_28_;
  auVar67._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar44 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  auVar45 = vmulss_avx512f(auVar45,auVar53);
  auVar53 = vmulss_avx512f(auVar53,auVar53);
  auVar53 = vmulss_avx512f(auVar45,auVar53);
  auVar53 = vsubss_avx512f(auVar44,auVar53);
  auVar44 = vbroadcastss_avx512vl(auVar53);
  auVar45 = vmulps_avx512vl(auVar57,auVar44);
  auVar53 = vdpps_avx(auVar57,auVar60,0x7f);
  auVar46 = vbroadcastss_avx512vl(auVar55);
  auVar60 = vmulps_avx512vl(auVar46,auVar60);
  fVar216 = auVar53._0_4_;
  auVar131._0_4_ = auVar57._0_4_ * fVar216;
  auVar131._4_4_ = auVar57._4_4_ * fVar216;
  auVar131._8_4_ = auVar57._8_4_ * fVar216;
  auVar131._12_4_ = auVar57._12_4_ * fVar216;
  auVar53 = vsubps_avx(auVar60,auVar131);
  auVar57 = vrcp14ss_avx512f(auVar79._0_16_,auVar67._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar57,ZEXT416(0x40000000));
  fVar216 = auVar57._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar54,auVar54,0x7f);
  auVar132._0_4_ = fVar216 * auVar53._0_4_;
  auVar132._4_4_ = fVar216 * auVar53._4_4_;
  auVar132._8_4_ = fVar216 * auVar53._8_4_;
  auVar132._12_4_ = fVar216 * auVar53._12_4_;
  auVar57 = vmulps_avx512vl(auVar44,auVar132);
  auVar68._16_16_ = auVar79._16_16_;
  auVar68._0_16_ = auVar79._0_16_;
  auVar69._4_28_ = auVar68._4_28_;
  auVar69._0_4_ = auVar55._0_4_;
  auVar53 = vrsqrt14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar60 = vmulss_avx512f(auVar53,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar55,ZEXT416(0x3f000000));
  auVar248 = ZEXT464(0x3f800000);
  auVar44 = vmulss_avx512f(auVar44,auVar53);
  auVar53 = vmulss_avx512f(auVar44,ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)));
  fVar200 = auVar60._0_4_ - auVar53._0_4_;
  auVar235._0_4_ = auVar54._0_4_ * fVar200;
  auVar235._4_4_ = auVar54._4_4_ * fVar200;
  auVar235._8_4_ = auVar54._8_4_ * fVar200;
  auVar235._12_4_ = auVar54._12_4_ * fVar200;
  auVar53 = vdpps_avx(auVar54,auVar61,0x7f);
  auVar60 = vbroadcastss_avx512vl(auVar55);
  auVar60 = vmulps_avx512vl(auVar60,auVar61);
  fVar216 = auVar53._0_4_;
  auVar148._0_4_ = auVar54._0_4_ * fVar216;
  auVar148._4_4_ = auVar54._4_4_ * fVar216;
  auVar148._8_4_ = auVar54._8_4_ * fVar216;
  auVar148._12_4_ = auVar54._12_4_ * fVar216;
  auVar53 = vsubps_avx(auVar60,auVar148);
  auVar60 = vrcp14ss_avx512f(auVar79._0_16_,auVar69._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar60,ZEXT416(0x40000000));
  fVar216 = auVar60._0_4_ * auVar55._0_4_;
  auVar60 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar54 = vmulps_avx512vl(auVar60,auVar45);
  auVar61 = vsubps_avx512vl(auVar38,auVar54);
  auVar55 = vshufps_avx(auVar39,auVar39,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar45);
  auVar133._0_4_ = auVar55._0_4_ + auVar60._0_4_ * auVar57._0_4_;
  auVar133._4_4_ = auVar55._4_4_ + auVar60._4_4_ * auVar57._4_4_;
  auVar133._8_4_ = auVar55._8_4_ + auVar60._8_4_ * auVar57._8_4_;
  auVar133._12_4_ = auVar55._12_4_ + auVar60._12_4_ * auVar57._12_4_;
  auVar55 = vsubps_avx(auVar39,auVar133);
  auVar57 = vaddps_avx512vl(auVar38,auVar54);
  auVar60 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar224._0_4_ = auVar60._0_4_ * auVar235._0_4_;
  auVar224._4_4_ = auVar60._4_4_ * auVar235._4_4_;
  auVar224._8_4_ = auVar60._8_4_ * auVar235._8_4_;
  auVar224._12_4_ = auVar60._12_4_ * auVar235._12_4_;
  auVar54 = vsubps_avx512vl(auVar40,auVar224);
  auVar44 = vshufps_avx512vl(auVar47,auVar47,0xff);
  auVar44 = vmulps_avx512vl(auVar44,auVar235);
  auVar149._0_4_ = auVar44._0_4_ + auVar60._0_4_ * fVar200 * fVar216 * auVar53._0_4_;
  auVar149._4_4_ = auVar44._4_4_ + auVar60._4_4_ * fVar200 * fVar216 * auVar53._4_4_;
  auVar149._8_4_ = auVar44._8_4_ + auVar60._8_4_ * fVar200 * fVar216 * auVar53._8_4_;
  auVar149._12_4_ = auVar44._12_4_ + auVar60._12_4_ * fVar200 * fVar216 * auVar53._12_4_;
  auVar53 = vsubps_avx512vl(auVar47,auVar149);
  auVar60 = vaddps_avx512vl(auVar40,auVar224);
  auVar47 = vaddps_avx512vl(auVar47,auVar149);
  auVar193._0_4_ = auVar61._0_4_ + auVar55._0_4_ * 0.33333334;
  auVar193._4_4_ = auVar61._4_4_ + auVar55._4_4_ * 0.33333334;
  auVar193._8_4_ = auVar61._8_4_ + auVar55._8_4_ * 0.33333334;
  auVar193._12_4_ = auVar61._12_4_ + auVar55._12_4_ * 0.33333334;
  auVar181._0_4_ = auVar53._0_4_ * 0.33333334;
  auVar181._4_4_ = auVar53._4_4_ * 0.33333334;
  auVar181._8_4_ = auVar53._8_4_ * 0.33333334;
  auVar181._12_4_ = auVar53._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar54,auVar181);
  auVar134._0_4_ = auVar57._0_4_ + (fVar211 + auVar133._0_4_) * 0.33333334;
  auVar134._4_4_ = auVar57._4_4_ + (fVar212 + auVar133._4_4_) * 0.33333334;
  auVar134._8_4_ = auVar57._8_4_ + (fVar213 + auVar133._8_4_) * 0.33333334;
  auVar134._12_4_ = auVar57._12_4_ + (fVar214 + auVar133._12_4_) * 0.33333334;
  auVar150._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar150._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar150._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar150._12_4_ = auVar47._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar60,auVar150);
  auVar47 = vbroadcastss_avx512vl(auVar51);
  auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar51);
  auVar100._0_4_ = auVar44._0_4_;
  auVar100._4_4_ = auVar100._0_4_;
  auVar100._8_4_ = auVar100._0_4_;
  auVar100._12_4_ = auVar100._0_4_;
  auVar61 = vmulps_avx512vl(auVar47,auVar61);
  auVar44 = vmulps_avx512vl(auVar47,auVar193);
  auVar55 = vmulps_avx512vl(auVar47,auVar55);
  auVar230._0_4_ = auVar47._0_4_ * auVar54._0_4_;
  auVar230._4_4_ = auVar47._4_4_ * auVar54._4_4_;
  auVar230._8_4_ = auVar47._8_4_ * auVar54._8_4_;
  auVar230._12_4_ = auVar47._12_4_ * auVar54._12_4_;
  local_1a8 = vfmadd231ps_avx512vl(auVar61,auVar100,auVar59);
  local_1b8 = vfmadd231ps_avx512vl(auVar44,auVar100,auVar161);
  local_1c8 = vfmadd231ps_avx512vl(auVar55,auVar100,auVar62);
  local_1d8 = vfmadd231ps_fma(auVar230,auVar100,auVar52);
  auVar55 = vmulps_avx512vl(auVar47,auVar57);
  auVar57 = vmulps_avx512vl(auVar47,auVar134);
  auVar53 = vmulps_avx512vl(auVar47,auVar53);
  auVar225._0_4_ = auVar47._0_4_ * auVar60._0_4_;
  auVar225._4_4_ = auVar47._4_4_ * auVar60._4_4_;
  auVar225._8_4_ = auVar47._8_4_ * auVar60._8_4_;
  auVar225._12_4_ = auVar47._12_4_ * auVar60._12_4_;
  _local_1e8 = vfmadd231ps_avx512vl(auVar55,auVar100,auVar58);
  _local_1f8 = vfmadd231ps_avx512vl(auVar57,auVar100,_local_318);
  _local_208 = vfmadd231ps_avx512vl(auVar53,auVar100,auVar63);
  _local_218 = vfmadd231ps_fma(auVar225,auVar100,auVar37);
  aVar3 = (ray->org).field_0;
  auVar53 = vsubps_avx512vl(local_1a8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar108._4_4_ = uVar98;
  auVar108._0_4_ = uVar98;
  auVar108._8_4_ = uVar98;
  auVar108._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  aVar4 = (pre->ray_space).vx.field_0;
  aVar5 = (pre->ray_space).vy.field_0;
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  fVar216 = (pre->ray_space).vz.field_0.m128[0];
  fVar200 = (pre->ray_space).vz.field_0.m128[1];
  fVar211 = (pre->ray_space).vz.field_0.m128[2];
  fVar212 = (pre->ray_space).vz.field_0.m128[3];
  auVar101._0_4_ = fVar216 * auVar53._0_4_;
  auVar101._4_4_ = fVar200 * auVar53._4_4_;
  auVar101._8_4_ = fVar211 * auVar53._8_4_;
  auVar101._12_4_ = fVar212 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar5,auVar55);
  auVar54 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar108);
  auVar53 = vsubps_avx512vl(local_1b8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar111._4_4_ = uVar98;
  auVar111._0_4_ = uVar98;
  auVar111._8_4_ = uVar98;
  auVar111._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar109._0_4_ = fVar216 * auVar53._0_4_;
  auVar109._4_4_ = fVar200 * auVar53._4_4_;
  auVar109._8_4_ = fVar211 * auVar53._8_4_;
  auVar109._12_4_ = fVar212 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar5,auVar55);
  auVar61 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar111);
  auVar53 = vsubps_avx512vl(local_1c8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar151._4_4_ = uVar98;
  auVar151._0_4_ = uVar98;
  auVar151._8_4_ = uVar98;
  auVar151._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar112._0_4_ = fVar216 * auVar53._0_4_;
  auVar112._4_4_ = fVar200 * auVar53._4_4_;
  auVar112._8_4_ = fVar211 * auVar53._8_4_;
  auVar112._12_4_ = fVar212 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar112,(undefined1  [16])aVar5,auVar55);
  auVar62 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar151);
  auVar53 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar175._4_4_ = uVar98;
  auVar175._0_4_ = uVar98;
  auVar175._8_4_ = uVar98;
  auVar175._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar152._0_4_ = fVar216 * auVar53._0_4_;
  auVar152._4_4_ = fVar200 * auVar53._4_4_;
  auVar152._8_4_ = fVar211 * auVar53._8_4_;
  auVar152._12_4_ = fVar212 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar5,auVar55);
  auVar63 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar175);
  auVar53 = vsubps_avx512vl(_local_1e8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar182._4_4_ = uVar98;
  auVar182._0_4_ = uVar98;
  auVar182._8_4_ = uVar98;
  auVar182._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar176._0_4_ = auVar53._0_4_ * fVar216;
  auVar176._4_4_ = auVar53._4_4_ * fVar200;
  auVar176._8_4_ = auVar53._8_4_ * fVar211;
  auVar176._12_4_ = auVar53._12_4_ * fVar212;
  auVar55 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar55);
  auVar47 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar182);
  auVar53 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar194._4_4_ = uVar98;
  auVar194._0_4_ = uVar98;
  auVar194._8_4_ = uVar98;
  auVar194._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar183._0_4_ = auVar53._0_4_ * fVar216;
  auVar183._4_4_ = auVar53._4_4_ * fVar200;
  auVar183._8_4_ = auVar53._8_4_ * fVar211;
  auVar183._12_4_ = auVar53._12_4_ * fVar212;
  auVar55 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar55);
  auVar44 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar194);
  auVar53 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar201._4_4_ = uVar98;
  auVar201._0_4_ = uVar98;
  auVar201._8_4_ = uVar98;
  auVar201._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar195._0_4_ = auVar53._0_4_ * fVar216;
  auVar195._4_4_ = auVar53._4_4_ * fVar200;
  auVar195._8_4_ = auVar53._8_4_ * fVar211;
  auVar195._12_4_ = auVar53._12_4_ * fVar212;
  auVar55 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar55);
  auVar45 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar201);
  auVar53 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  uVar98 = auVar53._0_4_;
  auVar202._4_4_ = uVar98;
  auVar202._0_4_ = uVar98;
  auVar202._8_4_ = uVar98;
  auVar202._12_4_ = uVar98;
  auVar55 = vshufps_avx(auVar53,auVar53,0x55);
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar125._0_4_ = fVar216 * auVar53._0_4_;
  auVar125._4_4_ = fVar200 * auVar53._4_4_;
  auVar125._8_4_ = fVar211 * auVar53._8_4_;
  auVar125._12_4_ = fVar212 * auVar53._12_4_;
  auVar55 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar5,auVar55);
  auVar46 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar202);
  _local_318 = vmovlhps_avx(auVar54,auVar47);
  local_328 = vmovlhps_avx(auVar61,auVar44);
  local_278 = vmovlhps_avx512f(auVar62,auVar45);
  _local_f8 = vmovlhps_avx512f(auVar63,auVar46);
  auVar53 = vminps_avx(_local_318,local_328);
  auVar55 = vmaxps_avx(_local_318,local_328);
  auVar57 = vminps_avx512vl(local_278,_local_f8);
  auVar53 = vminps_avx(auVar53,auVar57);
  auVar57 = vmaxps_avx512vl(local_278,_local_f8);
  auVar55 = vmaxps_avx(auVar55,auVar57);
  auVar57 = vshufpd_avx(auVar53,auVar53,3);
  auVar60 = vshufpd_avx(auVar55,auVar55,3);
  auVar53 = vminps_avx(auVar53,auVar57);
  auVar55 = vmaxps_avx(auVar55,auVar60);
  auVar53 = vandps_avx512vl(auVar53,auVar246._0_16_);
  auVar55 = vandps_avx512vl(auVar55,auVar246._0_16_);
  auVar55 = vmaxps_avx(auVar53,auVar55);
  auVar53 = vmovshdup_avx(auVar55);
  auVar55 = vmaxss_avx(auVar53,auVar55);
  lVar28 = uVar31 + 0xf;
  fVar216 = auVar55._0_4_ * 9.536743e-07;
  local_288._8_8_ = auVar54._0_8_;
  local_288._0_8_ = auVar54._0_8_;
  local_298._8_8_ = auVar61._0_8_;
  local_298._0_8_ = auVar61._0_8_;
  local_2a8 = vmovddup_avx512vl(auVar62);
  local_2b8 = vmovddup_avx512vl(auVar63);
  register0x00001348 = auVar47._0_8_;
  local_2c8 = auVar47._0_8_;
  register0x00001388 = auVar44._0_8_;
  local_2d8 = auVar44._0_8_;
  register0x00001408 = auVar45._0_8_;
  local_2e8 = auVar45._0_8_;
  register0x00001448 = auVar46._0_8_;
  local_2f8 = auVar46._0_8_;
  local_108 = ZEXT416((uint)fVar216);
  auVar102._4_4_ = fVar216;
  auVar102._0_4_ = fVar216;
  auVar102._8_4_ = fVar216;
  auVar102._12_4_ = fVar216;
  local_78._16_4_ = fVar216;
  local_78._0_16_ = auVar102;
  local_78._20_4_ = fVar216;
  local_78._24_4_ = fVar216;
  local_78._28_4_ = fVar216;
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar55 = vxorps_avx512vl(auVar102,auVar15);
  local_98 = auVar55._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  uStack_88 = local_98;
  uStack_84 = local_98;
  uStack_80 = local_98;
  uStack_7c = local_98;
  local_c8 = vsubps_avx(local_328,_local_318);
  local_d8 = vsubps_avx512vl(local_278,local_328);
  local_e8 = vsubps_avx512vl(_local_f8,local_278);
  local_128 = vsubps_avx512vl(_local_1e8,local_1a8);
  local_138 = vsubps_avx512vl(_local_1f8,local_1b8);
  local_148 = vsubps_avx512vl(_local_208,local_1c8);
  _local_158 = vsubps_avx(_local_218,local_1d8);
  bVar32 = false;
  auVar55 = ZEXT816(0x3f80000000000000);
  uVar24 = 0;
  auVar39 = auVar55;
LAB_018ba923:
  auVar53 = vshufps_avx(auVar39,auVar39,0x50);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = 0x3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar234._16_4_ = 0x3f800000;
  auVar234._0_16_ = auVar231;
  auVar234._20_4_ = 0x3f800000;
  auVar234._24_4_ = 0x3f800000;
  auVar234._28_4_ = 0x3f800000;
  auVar57 = vsubps_avx(auVar231,auVar53);
  fVar216 = auVar53._0_4_;
  auVar126._0_4_ = local_2c8._0_4_ * fVar216;
  fVar200 = auVar53._4_4_;
  auVar126._4_4_ = local_2c8._4_4_ * fVar200;
  fVar211 = auVar53._8_4_;
  auVar126._8_4_ = local_2c8._8_4_ * fVar211;
  fVar212 = auVar53._12_4_;
  auVar126._12_4_ = local_2c8._12_4_ * fVar212;
  auVar135._0_4_ = local_2d8._0_4_ * fVar216;
  auVar135._4_4_ = local_2d8._4_4_ * fVar200;
  auVar135._8_4_ = local_2d8._8_4_ * fVar211;
  auVar135._12_4_ = local_2d8._12_4_ * fVar212;
  auVar153._0_4_ = local_2e8._0_4_ * fVar216;
  auVar153._4_4_ = local_2e8._4_4_ * fVar200;
  auVar153._8_4_ = local_2e8._8_4_ * fVar211;
  auVar153._12_4_ = local_2e8._12_4_ * fVar212;
  auVar113._0_4_ = local_2f8._0_4_ * fVar216;
  auVar113._4_4_ = local_2f8._4_4_ * fVar200;
  auVar113._8_4_ = local_2f8._8_4_ * fVar211;
  auVar113._12_4_ = local_2f8._12_4_ * fVar212;
  auVar60 = vfmadd231ps_fma(auVar126,auVar57,local_288);
  auVar54 = vfmadd231ps_fma(auVar135,auVar57,local_298);
  auVar61 = vfmadd231ps_avx512vl(auVar153,auVar57,local_2a8);
  auVar57 = vfmadd231ps_avx512vl(auVar113,local_2b8,auVar57);
  auVar53 = vmovshdup_avx(auVar55);
  fVar200 = auVar55._0_4_;
  fVar216 = (auVar53._0_4_ - fVar200) * 0.04761905;
  auVar142._4_4_ = fVar200;
  auVar142._0_4_ = fVar200;
  auVar142._8_4_ = fVar200;
  auVar142._12_4_ = fVar200;
  auVar142._16_4_ = fVar200;
  auVar142._20_4_ = fVar200;
  auVar142._24_4_ = fVar200;
  auVar142._28_4_ = fVar200;
  auVar74._0_8_ = auVar53._0_8_;
  auVar74._8_8_ = auVar74._0_8_;
  auVar74._16_8_ = auVar74._0_8_;
  auVar74._24_8_ = auVar74._0_8_;
  auVar83 = vsubps_avx(auVar74,auVar142);
  uVar98 = auVar60._0_4_;
  auVar123._4_4_ = uVar98;
  auVar123._0_4_ = uVar98;
  auVar123._8_4_ = uVar98;
  auVar123._12_4_ = uVar98;
  auVar123._16_4_ = uVar98;
  auVar123._20_4_ = uVar98;
  auVar123._24_4_ = uVar98;
  auVar123._28_4_ = uVar98;
  auVar75._8_4_ = 1;
  auVar75._0_8_ = 0x100000001;
  auVar75._12_4_ = 1;
  auVar75._16_4_ = 1;
  auVar75._20_4_ = 1;
  auVar75._24_4_ = 1;
  auVar75._28_4_ = 1;
  auVar82 = ZEXT1632(auVar60);
  auVar79 = vpermps_avx2(auVar75,auVar82);
  auVar64 = vbroadcastss_avx512vl(auVar54);
  auVar80 = ZEXT1632(auVar54);
  auVar65 = vpermps_avx512vl(auVar75,auVar80);
  auVar66 = vbroadcastss_avx512vl(auVar61);
  auVar81 = ZEXT1632(auVar61);
  auVar67 = vpermps_avx512vl(auVar75,auVar81);
  auVar68 = vbroadcastss_avx512vl(auVar57);
  auVar78 = ZEXT1632(auVar57);
  auVar69 = vpermps_avx512vl(auVar75,auVar78);
  auVar198._4_4_ = fVar216;
  auVar198._0_4_ = fVar216;
  auVar198._8_4_ = fVar216;
  auVar198._12_4_ = fVar216;
  auVar198._16_4_ = fVar216;
  auVar198._20_4_ = fVar216;
  auVar198._24_4_ = fVar216;
  auVar198._28_4_ = fVar216;
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  auVar70 = vpermps_avx512vl(auVar76,auVar82);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar72 = vpermps_avx512vl(auVar71,auVar82);
  auVar73 = vpermps_avx512vl(auVar76,auVar80);
  auVar74 = vpermps_avx512vl(auVar71,auVar80);
  auVar82 = vpermps_avx2(auVar76,auVar81);
  auVar75 = vpermps_avx512vl(auVar71,auVar81);
  auVar76 = vpermps_avx512vl(auVar76,auVar78);
  auVar77 = vpermps_avx512vl(auVar71,auVar78);
  auVar53 = vfmadd132ps_fma(auVar83,auVar142,_DAT_01f7b040);
  auVar83 = vsubps_avx(auVar234,ZEXT1632(auVar53));
  auVar71 = vmulps_avx512vl(auVar64,ZEXT1632(auVar53));
  auVar80 = ZEXT1632(auVar53);
  auVar78 = vmulps_avx512vl(auVar65,auVar80);
  auVar57 = vfmadd231ps_fma(auVar71,auVar83,auVar123);
  auVar60 = vfmadd231ps_fma(auVar78,auVar83,auVar79);
  auVar71 = vmulps_avx512vl(auVar66,auVar80);
  auVar78 = vmulps_avx512vl(auVar67,auVar80);
  auVar64 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar64);
  auVar65 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar65);
  auVar71 = vmulps_avx512vl(auVar68,auVar80);
  auVar123 = ZEXT1632(auVar53);
  auVar69 = vmulps_avx512vl(auVar69,auVar123);
  auVar66 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar66);
  auVar67 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar67);
  fVar211 = auVar53._0_4_;
  fVar212 = auVar53._4_4_;
  auVar71._4_4_ = fVar212 * auVar64._4_4_;
  auVar71._0_4_ = fVar211 * auVar64._0_4_;
  fVar213 = auVar53._8_4_;
  auVar71._8_4_ = fVar213 * auVar64._8_4_;
  fVar214 = auVar53._12_4_;
  auVar71._12_4_ = fVar214 * auVar64._12_4_;
  auVar71._16_4_ = auVar64._16_4_ * 0.0;
  auVar71._20_4_ = auVar64._20_4_ * 0.0;
  auVar71._24_4_ = auVar64._24_4_ * 0.0;
  auVar71._28_4_ = fVar200;
  auVar78._4_4_ = fVar212 * auVar65._4_4_;
  auVar78._0_4_ = fVar211 * auVar65._0_4_;
  auVar78._8_4_ = fVar213 * auVar65._8_4_;
  auVar78._12_4_ = fVar214 * auVar65._12_4_;
  auVar78._16_4_ = auVar65._16_4_ * 0.0;
  auVar78._20_4_ = auVar65._20_4_ * 0.0;
  auVar78._24_4_ = auVar65._24_4_ * 0.0;
  auVar78._28_4_ = auVar79._28_4_;
  auVar57 = vfmadd231ps_fma(auVar71,auVar83,ZEXT1632(auVar57));
  auVar60 = vfmadd231ps_fma(auVar78,auVar83,ZEXT1632(auVar60));
  auVar84._0_4_ = fVar211 * auVar66._0_4_;
  auVar84._4_4_ = fVar212 * auVar66._4_4_;
  auVar84._8_4_ = fVar213 * auVar66._8_4_;
  auVar84._12_4_ = fVar214 * auVar66._12_4_;
  auVar84._16_4_ = auVar66._16_4_ * 0.0;
  auVar84._20_4_ = auVar66._20_4_ * 0.0;
  auVar84._24_4_ = auVar66._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar80._4_4_ = fVar212 * auVar67._4_4_;
  auVar80._0_4_ = fVar211 * auVar67._0_4_;
  auVar80._8_4_ = fVar213 * auVar67._8_4_;
  auVar80._12_4_ = fVar214 * auVar67._12_4_;
  auVar80._16_4_ = auVar67._16_4_ * 0.0;
  auVar80._20_4_ = auVar67._20_4_ * 0.0;
  auVar80._24_4_ = auVar67._24_4_ * 0.0;
  auVar80._28_4_ = auVar66._28_4_;
  auVar54 = vfmadd231ps_fma(auVar84,auVar83,auVar64);
  auVar61 = vfmadd231ps_fma(auVar80,auVar83,auVar65);
  auVar81._28_4_ = auVar65._28_4_;
  auVar81._0_28_ =
       ZEXT1628(CONCAT412(fVar214 * auVar61._12_4_,
                          CONCAT48(fVar213 * auVar61._8_4_,
                                   CONCAT44(fVar212 * auVar61._4_4_,fVar211 * auVar61._0_4_))));
  auVar62 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar214 * auVar54._12_4_,
                                               CONCAT48(fVar213 * auVar54._8_4_,
                                                        CONCAT44(fVar212 * auVar54._4_4_,
                                                                 fVar211 * auVar54._0_4_)))),auVar83
                            ,ZEXT1632(auVar57));
  auVar63 = vfmadd231ps_fma(auVar81,auVar83,ZEXT1632(auVar60));
  auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar57));
  auVar64 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar60));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar79 = vmulps_avx512vl(auVar79,auVar65);
  auVar64 = vmulps_avx512vl(auVar64,auVar65);
  auVar192._0_4_ = fVar216 * auVar79._0_4_;
  auVar192._4_4_ = fVar216 * auVar79._4_4_;
  auVar192._8_4_ = fVar216 * auVar79._8_4_;
  auVar192._12_4_ = fVar216 * auVar79._12_4_;
  auVar192._16_4_ = fVar216 * auVar79._16_4_;
  auVar192._20_4_ = fVar216 * auVar79._20_4_;
  auVar192._24_4_ = fVar216 * auVar79._24_4_;
  auVar192._28_4_ = 0;
  auVar79 = vmulps_avx512vl(auVar198,auVar64);
  auVar60 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
  auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_01fb9fc0,ZEXT1632(auVar60));
  auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar60));
  auVar118._0_4_ = auVar192._0_4_ + auVar62._0_4_;
  auVar118._4_4_ = auVar192._4_4_ + auVar62._4_4_;
  auVar118._8_4_ = auVar192._8_4_ + auVar62._8_4_;
  auVar118._12_4_ = auVar192._12_4_ + auVar62._12_4_;
  auVar118._16_4_ = auVar192._16_4_ + 0.0;
  auVar118._20_4_ = auVar192._20_4_ + 0.0;
  auVar118._24_4_ = auVar192._24_4_ + 0.0;
  auVar118._28_4_ = 0;
  auVar84 = ZEXT1632(auVar60);
  auVar67 = vpermt2ps_avx512vl(auVar192,_DAT_01fb9fc0,auVar84);
  auVar68 = vaddps_avx512vl(ZEXT1632(auVar63),auVar79);
  auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar84);
  auVar79 = vsubps_avx(auVar64,auVar67);
  auVar67 = vsubps_avx512vl(auVar66,auVar69);
  auVar69 = vmulps_avx512vl(auVar73,auVar123);
  auVar71 = vmulps_avx512vl(auVar74,auVar123);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,auVar72);
  auVar78 = vmulps_avx512vl(auVar82,auVar123);
  auVar80 = vmulps_avx512vl(auVar75,auVar123);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar73);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar74);
  auVar81 = vmulps_avx512vl(auVar76,auVar123);
  auVar70 = vmulps_avx512vl(auVar77,auVar123);
  auVar57 = vfmadd231ps_fma(auVar81,auVar83,auVar82);
  auVar82 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar75);
  auVar81 = vmulps_avx512vl(auVar123,auVar78);
  auVar72 = ZEXT1632(auVar53);
  auVar70 = vmulps_avx512vl(auVar72,auVar80);
  auVar69 = vfmadd231ps_avx512vl(auVar81,auVar83,auVar69);
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar71);
  auVar82 = vmulps_avx512vl(auVar72,auVar82);
  auVar78 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar214 * auVar57._12_4_,
                                          CONCAT48(fVar213 * auVar57._8_4_,
                                                   CONCAT44(fVar212 * auVar57._4_4_,
                                                            fVar211 * auVar57._0_4_)))),auVar83,
                       auVar78);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar80);
  auVar70._4_4_ = fVar212 * auVar78._4_4_;
  auVar70._0_4_ = fVar211 * auVar78._0_4_;
  auVar70._8_4_ = fVar213 * auVar78._8_4_;
  auVar70._12_4_ = fVar214 * auVar78._12_4_;
  auVar70._16_4_ = auVar78._16_4_ * 0.0;
  auVar70._20_4_ = auVar78._20_4_ * 0.0;
  auVar70._24_4_ = auVar78._24_4_ * 0.0;
  auVar70._28_4_ = auVar75._28_4_;
  auVar80 = vmulps_avx512vl(auVar72,auVar82);
  auVar81 = vfmadd231ps_avx512vl(auVar70,auVar83,auVar69);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar71,auVar83);
  auVar83 = vsubps_avx512vl(auVar78,auVar69);
  auVar82 = vsubps_avx512vl(auVar82,auVar71);
  auVar83 = vmulps_avx512vl(auVar83,auVar65);
  auVar82 = vmulps_avx512vl(auVar82,auVar65);
  fVar200 = fVar216 * auVar83._0_4_;
  fVar211 = fVar216 * auVar83._4_4_;
  auVar72._4_4_ = fVar211;
  auVar72._0_4_ = fVar200;
  fVar212 = fVar216 * auVar83._8_4_;
  auVar72._8_4_ = fVar212;
  fVar213 = fVar216 * auVar83._12_4_;
  auVar72._12_4_ = fVar213;
  fVar214 = fVar216 * auVar83._16_4_;
  auVar72._16_4_ = fVar214;
  fVar215 = fVar216 * auVar83._20_4_;
  auVar72._20_4_ = fVar215;
  fVar216 = fVar216 * auVar83._24_4_;
  auVar72._24_4_ = fVar216;
  auVar72._28_4_ = auVar83._28_4_;
  auVar82 = vmulps_avx512vl(auVar198,auVar82);
  auVar65 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,auVar84);
  auVar69 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar84);
  auVar199._0_4_ = auVar81._0_4_ + fVar200;
  auVar199._4_4_ = auVar81._4_4_ + fVar211;
  auVar199._8_4_ = auVar81._8_4_ + fVar212;
  auVar199._12_4_ = auVar81._12_4_ + fVar213;
  auVar199._16_4_ = auVar81._16_4_ + fVar214;
  auVar199._20_4_ = auVar81._20_4_ + fVar215;
  auVar199._24_4_ = auVar81._24_4_ + fVar216;
  auVar199._28_4_ = auVar81._28_4_ + auVar83._28_4_;
  auVar83 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,ZEXT1632(auVar60));
  auVar71 = vaddps_avx512vl(auVar80,auVar82);
  auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,ZEXT1632(auVar60));
  auVar83 = vsubps_avx(auVar65,auVar83);
  auVar82 = vsubps_avx512vl(auVar69,auVar82);
  auVar123 = ZEXT1632(auVar62);
  auVar78 = vsubps_avx512vl(auVar81,auVar123);
  auVar142 = ZEXT1632(auVar63);
  auVar70 = vsubps_avx512vl(auVar80,auVar142);
  auVar72 = vsubps_avx512vl(auVar65,auVar64);
  auVar78 = vaddps_avx512vl(auVar78,auVar72);
  auVar72 = vsubps_avx512vl(auVar69,auVar66);
  auVar70 = vaddps_avx512vl(auVar70,auVar72);
  auVar72 = vmulps_avx512vl(auVar142,auVar78);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar123,auVar70);
  auVar73 = vmulps_avx512vl(auVar68,auVar78);
  auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar118,auVar70);
  auVar74 = vmulps_avx512vl(auVar67,auVar78);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar79,auVar70);
  auVar75 = vmulps_avx512vl(auVar66,auVar78);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar64,auVar70);
  auVar76 = vmulps_avx512vl(auVar80,auVar78);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar81,auVar70);
  auVar77 = vmulps_avx512vl(auVar71,auVar78);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar199,auVar70);
  auVar84 = vmulps_avx512vl(auVar82,auVar78);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar83,auVar70);
  auVar78 = vmulps_avx512vl(auVar69,auVar78);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar70);
  auVar70 = vminps_avx512vl(auVar72,auVar73);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar74,auVar75);
  auVar70 = vminps_avx512vl(auVar70,auVar73);
  auVar73 = vmaxps_avx512vl(auVar74,auVar75);
  auVar72 = vmaxps_avx512vl(auVar72,auVar73);
  auVar73 = vminps_avx512vl(auVar76,auVar77);
  auVar74 = vmaxps_avx512vl(auVar76,auVar77);
  auVar75 = vminps_avx512vl(auVar84,auVar78);
  auVar73 = vminps_avx512vl(auVar73,auVar75);
  auVar70 = vminps_avx512vl(auVar70,auVar73);
  auVar78 = vmaxps_avx512vl(auVar84,auVar78);
  auVar78 = vmaxps_avx512vl(auVar74,auVar78);
  auVar78 = vmaxps_avx512vl(auVar72,auVar78);
  uVar13 = vcmpps_avx512vl(auVar70,local_78,2);
  auVar73._4_4_ = uStack_94;
  auVar73._0_4_ = local_98;
  auVar73._8_4_ = uStack_90;
  auVar73._12_4_ = uStack_8c;
  auVar73._16_4_ = uStack_88;
  auVar73._20_4_ = uStack_84;
  auVar73._24_4_ = uStack_80;
  auVar73._28_4_ = uStack_7c;
  uVar14 = vcmpps_avx512vl(auVar78,auVar73,5);
  bVar22 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar22 != 0) {
    auVar78 = vsubps_avx512vl(auVar64,auVar123);
    auVar70 = vsubps_avx512vl(auVar66,auVar142);
    auVar72 = vsubps_avx512vl(auVar65,auVar81);
    auVar78 = vaddps_avx512vl(auVar78,auVar72);
    auVar72 = vsubps_avx512vl(auVar69,auVar80);
    auVar70 = vaddps_avx512vl(auVar70,auVar72);
    auVar72 = vmulps_avx512vl(auVar142,auVar78);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar70,auVar123);
    auVar68 = vmulps_avx512vl(auVar68,auVar78);
    auVar68 = vfnmadd213ps_avx512vl(auVar118,auVar70,auVar68);
    auVar67 = vmulps_avx512vl(auVar67,auVar78);
    auVar67 = vfnmadd213ps_avx512vl(auVar79,auVar70,auVar67);
    auVar79 = vmulps_avx512vl(auVar66,auVar78);
    auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar64);
    auVar79 = vmulps_avx512vl(auVar80,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar79,auVar70,auVar81);
    auVar79 = vmulps_avx512vl(auVar71,auVar78);
    auVar71 = vfnmadd213ps_avx512vl(auVar199,auVar70,auVar79);
    auVar79 = vmulps_avx512vl(auVar82,auVar78);
    auVar81 = vfnmadd213ps_avx512vl(auVar83,auVar70,auVar79);
    auVar83 = vmulps_avx512vl(auVar69,auVar78);
    auVar69 = vfnmadd231ps_avx512vl(auVar83,auVar65,auVar70);
    auVar79 = vminps_avx(auVar72,auVar68);
    auVar83 = vmaxps_avx(auVar72,auVar68);
    auVar64 = vminps_avx(auVar67,auVar66);
    auVar64 = vminps_avx(auVar79,auVar64);
    auVar79 = vmaxps_avx(auVar67,auVar66);
    auVar83 = vmaxps_avx(auVar83,auVar79);
    auVar82 = vminps_avx(auVar80,auVar71);
    auVar79 = vmaxps_avx(auVar80,auVar71);
    auVar65 = vminps_avx(auVar81,auVar69);
    auVar82 = vminps_avx(auVar82,auVar65);
    auVar82 = vminps_avx(auVar64,auVar82);
    auVar64 = vmaxps_avx(auVar81,auVar69);
    auVar79 = vmaxps_avx(auVar79,auVar64);
    auVar83 = vmaxps_avx(auVar83,auVar79);
    uVar13 = vcmpps_avx512vl(auVar83,auVar73,5);
    uVar14 = vcmpps_avx512vl(auVar82,local_78,2);
    bVar22 = bVar22 & (byte)uVar13 & (byte)uVar14;
    if (bVar22 != 0) {
      auStack_198[uVar24] = (uint)bVar22;
      uVar13 = vmovlps_avx(auVar55);
      (&uStack_b8)[uVar24] = uVar13;
      uVar2 = vmovlps_avx(auVar39);
      auStack_58[uVar24] = uVar2;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
  }
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar245 = ZEXT1664(auVar55);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT3264(auVar83);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar242 = ZEXT1664(auVar55);
  auVar243 = ZEXT3264(_DAT_01fb9fe0);
  auVar83 = _DAT_01fb9fe0;
LAB_018bae21:
  do {
    do {
      do {
        auVar244 = ZEXT464(0x3eaaaaab);
        auVar57 = auVar247._0_16_;
        auVar60 = auVar249._0_16_;
        auVar53 = auVar245._0_16_;
        if ((int)uVar24 == 0) {
          if (bVar32) goto LAB_018bbc53;
          fVar216 = ray->tfar;
          auVar21._4_4_ = fVar216;
          auVar21._0_4_ = fVar216;
          auVar21._8_4_ = fVar216;
          auVar21._12_4_ = fVar216;
          uVar13 = vcmpps_avx512vl(local_118,auVar21,2);
          uVar31 = (ulong)((uint)uVar31 & (uint)lVar28 & (uint)uVar13);
          goto LAB_018b9e9f;
        }
        uVar23 = (int)uVar24 - 1;
        uVar25 = (ulong)uVar23;
        uVar6 = auStack_198[uVar25];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auStack_58[uVar25];
        uVar2 = 0;
        for (uVar29 = (ulong)uVar6; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar27 = uVar6 - 1 & uVar6;
        bVar35 = uVar27 == 0;
        auStack_198[uVar25] = uVar27;
        if (bVar35) {
          uVar24 = (ulong)uVar23;
        }
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar2;
        auVar55 = vpunpcklqdq_avx(auVar103,ZEXT416((int)uVar2 + 1));
        auVar55 = vcvtqq2ps_avx512vl(auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar242._0_16_);
        uVar98 = *(undefined4 *)((long)&uStack_b8 + uVar25 * 8 + 4);
        auVar16._4_4_ = uVar98;
        auVar16._0_4_ = uVar98;
        auVar16._8_4_ = uVar98;
        auVar16._12_4_ = uVar98;
        auVar54 = vmulps_avx512vl(auVar55,auVar16);
        auVar55 = vsubps_avx512vl(auVar57,auVar55);
        uVar98 = *(undefined4 *)(&uStack_b8 + uVar25);
        auVar17._4_4_ = uVar98;
        auVar17._0_4_ = uVar98;
        auVar17._8_4_ = uVar98;
        auVar17._12_4_ = uVar98;
        auVar55 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar17);
        auVar54 = vmovshdup_avx(auVar55);
        fVar216 = auVar54._0_4_ - auVar55._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar216));
        if (uVar6 == 0 || bVar35) goto LAB_018ba923;
        auVar54 = vshufps_avx(auVar39,auVar39,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar216));
        auVar63 = vsubps_avx512vl(auVar57,auVar54);
        fVar200 = auVar54._0_4_;
        auVar136._0_4_ = fVar200 * (float)local_2c8._0_4_;
        fVar211 = auVar54._4_4_;
        auVar136._4_4_ = fVar211 * (float)local_2c8._4_4_;
        fVar212 = auVar54._8_4_;
        auVar136._8_4_ = fVar212 * fStack_2c0;
        fVar213 = auVar54._12_4_;
        auVar136._12_4_ = fVar213 * fStack_2bc;
        auVar154._0_4_ = fVar200 * (float)local_2d8._0_4_;
        auVar154._4_4_ = fVar211 * (float)local_2d8._4_4_;
        auVar154._8_4_ = fVar212 * fStack_2d0;
        auVar154._12_4_ = fVar213 * fStack_2cc;
        auVar162._0_4_ = fVar200 * (float)local_2e8._0_4_;
        auVar162._4_4_ = fVar211 * (float)local_2e8._4_4_;
        auVar162._8_4_ = fVar212 * fStack_2e0;
        auVar162._12_4_ = fVar213 * fStack_2dc;
        auVar119._0_4_ = fVar200 * (float)local_2f8._0_4_;
        auVar119._4_4_ = fVar211 * (float)local_2f8._4_4_;
        auVar119._8_4_ = fVar212 * fStack_2f0;
        auVar119._12_4_ = fVar213 * fStack_2ec;
        auVar54 = vfmadd231ps_fma(auVar136,auVar63,local_288);
        auVar61 = vfmadd231ps_fma(auVar154,auVar63,local_298);
        auVar62 = vfmadd231ps_fma(auVar162,auVar63,local_2a8);
        auVar63 = vfmadd231ps_fma(auVar119,auVar63,local_2b8);
        auVar77._16_16_ = auVar54;
        auVar77._0_16_ = auVar54;
        auVar143._16_16_ = auVar61;
        auVar143._0_16_ = auVar61;
        auVar158._16_16_ = auVar62;
        auVar158._0_16_ = auVar62;
        auVar79 = vpermps_avx512vl(auVar243._0_32_,ZEXT1632(auVar55));
        auVar83 = vsubps_avx(auVar143,auVar77);
        auVar61 = vfmadd213ps_fma(auVar83,auVar79,auVar77);
        auVar83 = vsubps_avx(auVar158,auVar143);
        auVar47 = vfmadd213ps_fma(auVar83,auVar79,auVar143);
        auVar54 = vsubps_avx(auVar63,auVar62);
        auVar144._16_16_ = auVar54;
        auVar144._0_16_ = auVar54;
        auVar54 = vfmadd213ps_fma(auVar144,auVar79,auVar158);
        auVar83 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar61));
        auVar61 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar61));
        auVar83 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar47));
        auVar54 = vfmadd213ps_fma(auVar83,auVar79,ZEXT1632(auVar47));
        auVar83 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar61));
        auVar51 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar83,auVar79);
        auVar83 = vmulps_avx512vl(auVar83,auVar241._0_32_);
        auVar54 = vmulss_avx512f(ZEXT416((uint)fVar216),auVar244._0_16_);
        fVar200 = auVar54._0_4_;
        auVar163._0_8_ =
             CONCAT44(auVar51._4_4_ + fVar200 * auVar83._4_4_,
                      auVar51._0_4_ + fVar200 * auVar83._0_4_);
        auVar163._8_4_ = auVar51._8_4_ + fVar200 * auVar83._8_4_;
        auVar163._12_4_ = auVar51._12_4_ + fVar200 * auVar83._12_4_;
        auVar137._0_4_ = fVar200 * auVar83._16_4_;
        auVar137._4_4_ = fVar200 * auVar83._20_4_;
        auVar137._8_4_ = fVar200 * auVar83._24_4_;
        auVar137._12_4_ = fVar200 * auVar83._28_4_;
        auVar48 = vsubps_avx((undefined1  [16])0x0,auVar137);
        auVar47 = vshufpd_avx(auVar51,auVar51,3);
        auVar44 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar54 = vsubps_avx(auVar47,auVar51);
        auVar61 = vsubps_avx(auVar44,(undefined1  [16])0x0);
        auVar184._0_4_ = auVar54._0_4_ + auVar61._0_4_;
        auVar184._4_4_ = auVar54._4_4_ + auVar61._4_4_;
        auVar184._8_4_ = auVar54._8_4_ + auVar61._8_4_;
        auVar184._12_4_ = auVar54._12_4_ + auVar61._12_4_;
        auVar54 = vshufps_avx(auVar51,auVar51,0xb1);
        auVar61 = vshufps_avx(auVar163,auVar163,0xb1);
        auVar62 = vshufps_avx(auVar48,auVar48,0xb1);
        auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar232._4_4_ = auVar184._0_4_;
        auVar232._0_4_ = auVar184._0_4_;
        auVar232._8_4_ = auVar184._0_4_;
        auVar232._12_4_ = auVar184._0_4_;
        auVar45 = vshufps_avx(auVar184,auVar184,0x55);
        fVar200 = auVar45._0_4_;
        auVar196._0_4_ = auVar54._0_4_ * fVar200;
        fVar211 = auVar45._4_4_;
        auVar196._4_4_ = auVar54._4_4_ * fVar211;
        fVar212 = auVar45._8_4_;
        auVar196._8_4_ = auVar54._8_4_ * fVar212;
        fVar213 = auVar45._12_4_;
        auVar196._12_4_ = auVar54._12_4_ * fVar213;
        auVar203._0_4_ = auVar61._0_4_ * fVar200;
        auVar203._4_4_ = auVar61._4_4_ * fVar211;
        auVar203._8_4_ = auVar61._8_4_ * fVar212;
        auVar203._12_4_ = auVar61._12_4_ * fVar213;
        auVar217._0_4_ = auVar62._0_4_ * fVar200;
        auVar217._4_4_ = auVar62._4_4_ * fVar211;
        auVar217._8_4_ = auVar62._8_4_ * fVar212;
        auVar217._12_4_ = auVar62._12_4_ * fVar213;
        auVar185._0_4_ = auVar63._0_4_ * fVar200;
        auVar185._4_4_ = auVar63._4_4_ * fVar211;
        auVar185._8_4_ = auVar63._8_4_ * fVar212;
        auVar185._12_4_ = auVar63._12_4_ * fVar213;
        auVar54 = vfmadd231ps_fma(auVar196,auVar232,auVar51);
        auVar61 = vfmadd231ps_fma(auVar203,auVar232,auVar163);
        auVar49 = vfmadd231ps_fma(auVar217,auVar232,auVar48);
        auVar50 = vfmadd231ps_fma(auVar185,(undefined1  [16])0x0,auVar232);
        auVar45 = vshufpd_avx(auVar54,auVar54,1);
        auVar46 = vshufpd_avx(auVar61,auVar61,1);
        auVar52 = vshufpd_avx512vl(auVar49,auVar49,1);
        auVar58 = vshufpd_avx512vl(auVar50,auVar50,1);
        auVar62 = vminss_avx(auVar54,auVar61);
        auVar54 = vmaxss_avx(auVar61,auVar54);
        auVar63 = vminss_avx(auVar49,auVar50);
        auVar61 = vmaxss_avx(auVar50,auVar49);
        auVar62 = vminss_avx(auVar62,auVar63);
        auVar54 = vmaxss_avx(auVar61,auVar54);
        auVar63 = vminss_avx(auVar45,auVar46);
        auVar61 = vmaxss_avx(auVar46,auVar45);
        auVar45 = vminss_avx512f(auVar52,auVar58);
        auVar46 = vmaxss_avx512f(auVar58,auVar52);
        auVar61 = vmaxss_avx(auVar46,auVar61);
        auVar83._0_16_ = vminss_avx512f(auVar63,auVar45);
        vucomiss_avx512f(auVar62);
        fVar211 = auVar61._0_4_;
        fVar200 = auVar54._0_4_;
        if (4 < (uint)uVar24) {
          bVar36 = fVar211 == -0.0001;
          bVar33 = NAN(fVar211);
          if (fVar211 <= -0.0001) goto LAB_018bb046;
          break;
        }
LAB_018bb046:
        auVar63 = vucomiss_avx512f(auVar83._0_16_);
        bVar36 = fVar211 <= -0.0001;
        bVar34 = -0.0001 < fVar200;
        bVar33 = bVar36;
        if (!bVar36) break;
        uVar13 = vcmpps_avx512vl(auVar62,auVar63,5);
        uVar14 = vcmpps_avx512vl(auVar83._0_16_,auVar63,5);
        bVar22 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar36 = bVar34 && bVar22 == 0;
        bVar33 = bVar34 && bVar22 == 0;
      } while (!bVar34 || bVar22 != 0);
      vcmpss_avx512f(auVar62,auVar60,1);
      auVar46 = auVar248._0_16_;
      uVar13 = vcmpss_avx512f(auVar54,auVar60,1);
      bVar34 = (bool)((byte)uVar13 & 1);
      auVar86._16_16_ = auVar83._16_16_;
      auVar86._0_16_ = auVar46;
      iVar97 = auVar248._0_4_;
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar97);
      vucomiss_avx512f(auVar85._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar34 = bVar33 == false;
      auVar88._16_16_ = auVar83._16_16_;
      auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (uint)bVar33 * auVar249._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar45 = auVar87._0_16_;
      auVar90._16_16_ = auVar83._16_16_;
      auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (uint)bVar33 * auVar249._0_4_ + (uint)!bVar33 * -0x800000;
      auVar63 = auVar89._0_16_;
      uVar13 = vcmpss_avx512f(auVar83._0_16_,auVar60,1);
      bVar36 = (bool)((byte)uVar13 & 1);
      auVar92._16_16_ = auVar83._16_16_;
      auVar92._0_16_ = auVar46;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar97);
      vucomiss_avx512f(auVar91._0_16_);
      if ((bVar33) || (bVar34)) {
        auVar49 = vucomiss_avx512f(auVar62);
        if ((bVar33) || (bVar34)) {
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar50 = vxorps_avx512vl(auVar62,auVar20);
          auVar62 = vsubss_avx512f(auVar49,auVar62);
          auVar62 = vdivss_avx512f(auVar50,auVar62);
          auVar49 = vsubss_avx512f(auVar46,auVar62);
          auVar62 = vfmadd213ss_avx512f(auVar49,auVar60,auVar62);
          auVar49 = auVar62;
        }
        else {
          auVar49 = vxorps_avx512vl(auVar49,auVar49);
          vucomiss_avx512f(auVar49);
          if ((bVar33) || (auVar62 = auVar46, bVar34)) {
            auVar62 = SUB6416(ZEXT464(0xff800000),0);
            auVar49 = ZEXT416(0x7f800000);
          }
        }
        auVar45 = vminss_avx512f(auVar45,auVar49);
        auVar63 = vmaxss_avx(auVar62,auVar63);
      }
      uVar13 = vcmpss_avx512f(auVar61,auVar60,1);
      bVar36 = (bool)((byte)uVar13 & 1);
      fVar212 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar97);
      if ((auVar85._0_4_ != fVar212) || (NAN(auVar85._0_4_) || NAN(fVar212))) {
        if ((fVar211 != fVar200) || (NAN(fVar211) || NAN(fVar200))) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar54 = vxorps_avx512vl(auVar54,auVar19);
          auVar186._0_4_ = auVar54._0_4_ / (fVar211 - fVar200);
          auVar186._4_12_ = auVar54._4_12_;
          auVar54 = vsubss_avx512f(auVar46,auVar186);
          auVar54 = vfmadd213ss_avx512f(auVar54,auVar60,auVar186);
          auVar61 = auVar54;
        }
        else if ((fVar200 != 0.0) ||
                (auVar54 = auVar46, auVar61 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar200))) {
          auVar54 = SUB6416(ZEXT464(0xff800000),0);
          auVar61 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar45 = vminss_avx(auVar45,auVar61);
        auVar63 = vmaxss_avx(auVar54,auVar63);
      }
      bVar36 = auVar91._0_4_ != fVar212;
      auVar54 = vminss_avx512f(auVar45,auVar46);
      auVar94._16_16_ = auVar83._16_16_;
      auVar94._0_16_ = auVar45;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar36 * auVar54._0_4_ + (uint)!bVar36 * auVar45._0_4_;
      auVar54 = vmaxss_avx512f(auVar46,auVar63);
      auVar96._16_16_ = auVar83._16_16_;
      auVar96._0_16_ = auVar63;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (uint)bVar36 * auVar54._0_4_ + (uint)!bVar36 * auVar63._0_4_;
      auVar54 = vmaxss_avx512f(auVar60,auVar93._0_16_);
      auVar83._0_16_ = vminss_avx512f(auVar95._0_16_,auVar46);
    } while (auVar83._0_4_ < auVar54._0_4_);
    auVar63 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
    auVar49 = vminss_avx512f(ZEXT416((uint)(auVar83._0_4_ + 0.1)),auVar46);
    auVar120._0_8_ = auVar51._0_8_;
    auVar120._8_8_ = auVar120._0_8_;
    auVar204._8_8_ = auVar163._0_8_;
    auVar204._0_8_ = auVar163._0_8_;
    auVar218._8_8_ = auVar48._0_8_;
    auVar218._0_8_ = auVar48._0_8_;
    auVar54 = vshufpd_avx(auVar163,auVar163,3);
    auVar61 = vshufpd_avx(auVar48,auVar48,3);
    auVar62 = vshufps_avx(auVar63,auVar49,0);
    auVar48 = vsubps_avx512vl(auVar57,auVar62);
    fVar200 = auVar62._0_4_;
    auVar155._0_4_ = fVar200 * auVar47._0_4_;
    fVar211 = auVar62._4_4_;
    auVar155._4_4_ = fVar211 * auVar47._4_4_;
    fVar212 = auVar62._8_4_;
    auVar155._8_4_ = fVar212 * auVar47._8_4_;
    fVar213 = auVar62._12_4_;
    auVar155._12_4_ = fVar213 * auVar47._12_4_;
    auVar164._0_4_ = fVar200 * auVar54._0_4_;
    auVar164._4_4_ = fVar211 * auVar54._4_4_;
    auVar164._8_4_ = fVar212 * auVar54._8_4_;
    auVar164._12_4_ = fVar213 * auVar54._12_4_;
    auVar236._0_4_ = auVar61._0_4_ * fVar200;
    auVar236._4_4_ = auVar61._4_4_ * fVar211;
    auVar236._8_4_ = auVar61._8_4_ * fVar212;
    auVar236._12_4_ = auVar61._12_4_ * fVar213;
    auVar138._0_4_ = fVar200 * auVar44._0_4_;
    auVar138._4_4_ = fVar211 * auVar44._4_4_;
    auVar138._8_4_ = fVar212 * auVar44._8_4_;
    auVar138._12_4_ = fVar213 * auVar44._12_4_;
    auVar47 = vfmadd231ps_fma(auVar155,auVar48,auVar120);
    auVar44 = vfmadd231ps_fma(auVar164,auVar48,auVar204);
    auVar45 = vfmadd231ps_fma(auVar236,auVar48,auVar218);
    auVar48 = vfmadd231ps_fma(auVar138,auVar48,ZEXT816(0));
    auVar61 = vsubss_avx512f(auVar46,auVar63);
    auVar54 = vmovshdup_avx(auVar39);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar63._0_4_)),auVar39,auVar61);
    auVar61 = vsubss_avx512f(auVar46,auVar49);
    auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * auVar49._0_4_)),auVar39,auVar61);
    auVar49 = vdivss_avx512f(auVar46,ZEXT416((uint)fVar216));
    auVar54 = vsubps_avx(auVar44,auVar47);
    auVar62 = vmulps_avx512vl(auVar54,auVar53);
    auVar54 = vsubps_avx(auVar45,auVar44);
    auVar63 = vmulps_avx512vl(auVar54,auVar53);
    auVar54 = vsubps_avx(auVar48,auVar45);
    auVar54 = vmulps_avx512vl(auVar54,auVar53);
    auVar61 = vminps_avx(auVar63,auVar54);
    auVar54 = vmaxps_avx(auVar63,auVar54);
    auVar61 = vminps_avx(auVar62,auVar61);
    auVar54 = vmaxps_avx(auVar62,auVar54);
    auVar62 = vshufpd_avx(auVar61,auVar61,3);
    auVar63 = vshufpd_avx(auVar54,auVar54,3);
    auVar61 = vminps_avx(auVar61,auVar62);
    auVar54 = vmaxps_avx(auVar54,auVar63);
    fVar216 = auVar49._0_4_;
    auVar187._0_4_ = auVar61._0_4_ * fVar216;
    auVar187._4_4_ = auVar61._4_4_ * fVar216;
    auVar187._8_4_ = auVar61._8_4_ * fVar216;
    auVar187._12_4_ = auVar61._12_4_ * fVar216;
    auVar177._0_4_ = fVar216 * auVar54._0_4_;
    auVar177._4_4_ = fVar216 * auVar54._4_4_;
    auVar177._8_4_ = fVar216 * auVar54._8_4_;
    auVar177._12_4_ = fVar216 * auVar54._12_4_;
    auVar49 = vdivss_avx512f(auVar46,ZEXT416((uint)(auVar58._0_4_ - auVar52._0_4_)));
    auVar54 = vshufpd_avx(auVar47,auVar47,3);
    auVar61 = vshufpd_avx(auVar44,auVar44,3);
    auVar62 = vshufpd_avx(auVar45,auVar45,3);
    auVar63 = vshufpd_avx(auVar48,auVar48,3);
    auVar54 = vsubps_avx(auVar54,auVar47);
    auVar47 = vsubps_avx(auVar61,auVar44);
    auVar44 = vsubps_avx(auVar62,auVar45);
    auVar63 = vsubps_avx(auVar63,auVar48);
    auVar61 = vminps_avx(auVar54,auVar47);
    auVar54 = vmaxps_avx(auVar54,auVar47);
    auVar62 = vminps_avx(auVar44,auVar63);
    auVar62 = vminps_avx(auVar61,auVar62);
    auVar61 = vmaxps_avx(auVar44,auVar63);
    auVar54 = vmaxps_avx(auVar54,auVar61);
    fVar216 = auVar49._0_4_;
    auVar219._0_4_ = fVar216 * auVar62._0_4_;
    auVar219._4_4_ = fVar216 * auVar62._4_4_;
    auVar219._8_4_ = fVar216 * auVar62._8_4_;
    auVar219._12_4_ = fVar216 * auVar62._12_4_;
    auVar205._0_4_ = fVar216 * auVar54._0_4_;
    auVar205._4_4_ = fVar216 * auVar54._4_4_;
    auVar205._8_4_ = fVar216 * auVar54._8_4_;
    auVar205._12_4_ = fVar216 * auVar54._12_4_;
    auVar63 = vinsertps_avx(auVar55,auVar52,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar55,_DAT_01fb9f90,auVar58);
    auVar110._0_4_ = auVar63._0_4_ + auVar59._0_4_;
    auVar110._4_4_ = auVar63._4_4_ + auVar59._4_4_;
    auVar110._8_4_ = auVar63._8_4_ + auVar59._8_4_;
    auVar110._12_4_ = auVar63._12_4_ + auVar59._12_4_;
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar49 = vmulps_avx512vl(auVar110,auVar18);
    auVar61 = vshufps_avx(auVar49,auVar49,0x54);
    uVar98 = auVar49._0_4_;
    auVar114._4_4_ = uVar98;
    auVar114._0_4_ = uVar98;
    auVar114._8_4_ = uVar98;
    auVar114._12_4_ = uVar98;
    auVar62 = vfmadd213ps_fma(local_c8,auVar114,_local_318);
    auVar47 = vfmadd213ps_fma(local_d8,auVar114,local_328);
    auVar44 = vfmadd213ps_fma(local_e8,auVar114,local_278);
    auVar54 = vsubps_avx(auVar47,auVar62);
    auVar62 = vfmadd213ps_fma(auVar54,auVar114,auVar62);
    auVar54 = vsubps_avx(auVar44,auVar47);
    auVar54 = vfmadd213ps_fma(auVar54,auVar114,auVar47);
    auVar54 = vsubps_avx(auVar54,auVar62);
    auVar62 = vfmadd231ps_fma(auVar62,auVar54,auVar114);
    auVar45 = vmulps_avx512vl(auVar54,auVar53);
    auVar226._8_8_ = auVar62._0_8_;
    auVar226._0_8_ = auVar62._0_8_;
    auVar54 = vshufpd_avx(auVar62,auVar62,3);
    auVar62 = vshufps_avx(auVar49,auVar49,0x55);
    auVar47 = vsubps_avx(auVar54,auVar226);
    auVar44 = vfmadd231ps_fma(auVar226,auVar62,auVar47);
    auVar237._8_8_ = auVar45._0_8_;
    auVar237._0_8_ = auVar45._0_8_;
    auVar54 = vshufpd_avx(auVar45,auVar45,3);
    auVar54 = vsubps_avx512vl(auVar54,auVar237);
    auVar54 = vfmadd213ps_avx512vl(auVar54,auVar62,auVar237);
    auVar115._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
    auVar115._8_4_ = auVar47._8_4_ ^ 0x80000000;
    auVar115._12_4_ = auVar47._12_4_ ^ 0x80000000;
    auVar62 = vmovshdup_avx512vl(auVar54);
    auVar238._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
    auVar238._8_4_ = auVar62._8_4_ ^ 0x80000000;
    auVar238._12_4_ = auVar62._12_4_ ^ 0x80000000;
    auVar45 = vmovshdup_avx512vl(auVar47);
    auVar48 = vpermt2ps_avx512vl(auVar238,ZEXT416(5),auVar47);
    auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar47._0_4_)),auVar54,auVar45);
    auVar47 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar115);
    auVar139._0_4_ = auVar62._0_4_;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar54 = vdivps_avx(auVar48,auVar139);
    auVar37 = vdivps_avx512vl(auVar47,auVar139);
    fVar216 = auVar44._0_4_;
    auVar62 = vshufps_avx(auVar44,auVar44,0x55);
    auVar227._0_4_ = fVar216 * auVar54._0_4_ + auVar62._0_4_ * auVar37._0_4_;
    auVar227._4_4_ = fVar216 * auVar54._4_4_ + auVar62._4_4_ * auVar37._4_4_;
    auVar227._8_4_ = fVar216 * auVar54._8_4_ + auVar62._8_4_ * auVar37._8_4_;
    auVar227._12_4_ = fVar216 * auVar54._12_4_ + auVar62._12_4_ * auVar37._12_4_;
    auVar50 = vsubps_avx(auVar61,auVar227);
    auVar62 = vmovshdup_avx(auVar54);
    auVar61 = vinsertps_avx(auVar187,auVar219,0x1c);
    auVar239._0_4_ = auVar62._0_4_ * auVar61._0_4_;
    auVar239._4_4_ = auVar62._4_4_ * auVar61._4_4_;
    auVar239._8_4_ = auVar62._8_4_ * auVar61._8_4_;
    auVar239._12_4_ = auVar62._12_4_ * auVar61._12_4_;
    auVar51 = vinsertps_avx512f(auVar177,auVar205,0x1c);
    auVar62 = vmulps_avx512vl(auVar62,auVar51);
    auVar48 = vminps_avx512vl(auVar239,auVar62);
    auVar44 = vmaxps_avx(auVar62,auVar239);
    auVar45 = vmovshdup_avx(auVar37);
    auVar62 = vinsertps_avx(auVar219,auVar187,0x4c);
    auVar220._0_4_ = auVar45._0_4_ * auVar62._0_4_;
    auVar220._4_4_ = auVar45._4_4_ * auVar62._4_4_;
    auVar220._8_4_ = auVar45._8_4_ * auVar62._8_4_;
    auVar220._12_4_ = auVar45._12_4_ * auVar62._12_4_;
    auVar47 = vinsertps_avx(auVar205,auVar177,0x4c);
    auVar206._0_4_ = auVar45._0_4_ * auVar47._0_4_;
    auVar206._4_4_ = auVar45._4_4_ * auVar47._4_4_;
    auVar206._8_4_ = auVar45._8_4_ * auVar47._8_4_;
    auVar206._12_4_ = auVar45._12_4_ * auVar47._12_4_;
    auVar45 = vminps_avx(auVar220,auVar206);
    auVar48 = vaddps_avx512vl(auVar48,auVar45);
    auVar45 = vmaxps_avx(auVar206,auVar220);
    auVar207._0_4_ = auVar44._0_4_ + auVar45._0_4_;
    auVar207._4_4_ = auVar44._4_4_ + auVar45._4_4_;
    auVar207._8_4_ = auVar44._8_4_ + auVar45._8_4_;
    auVar207._12_4_ = auVar44._12_4_ + auVar45._12_4_;
    auVar221._8_8_ = 0x3f80000000000000;
    auVar221._0_8_ = 0x3f80000000000000;
    auVar44 = vsubps_avx(auVar221,auVar207);
    auVar45 = vsubps_avx(auVar221,auVar48);
    auVar48 = vsubps_avx(auVar63,auVar49);
    auVar49 = vsubps_avx(auVar59,auVar49);
    fVar213 = auVar48._0_4_;
    auVar240._0_4_ = fVar213 * auVar44._0_4_;
    fVar214 = auVar48._4_4_;
    auVar240._4_4_ = fVar214 * auVar44._4_4_;
    fVar215 = auVar48._8_4_;
    auVar240._8_4_ = fVar215 * auVar44._8_4_;
    fVar159 = auVar48._12_4_;
    auVar240._12_4_ = fVar159 * auVar44._12_4_;
    auVar38 = vbroadcastss_avx512vl(auVar54);
    auVar61 = vmulps_avx512vl(auVar38,auVar61);
    auVar51 = vmulps_avx512vl(auVar38,auVar51);
    auVar38 = vminps_avx512vl(auVar61,auVar51);
    auVar51 = vmaxps_avx512vl(auVar51,auVar61);
    auVar61 = vbroadcastss_avx512vl(auVar37);
    auVar62 = vmulps_avx512vl(auVar61,auVar62);
    auVar61 = vmulps_avx512vl(auVar61,auVar47);
    auVar47 = vminps_avx512vl(auVar62,auVar61);
    auVar47 = vaddps_avx512vl(auVar38,auVar47);
    auVar48 = vmulps_avx512vl(auVar48,auVar45);
    fVar216 = auVar49._0_4_;
    auVar208._0_4_ = fVar216 * auVar44._0_4_;
    fVar200 = auVar49._4_4_;
    auVar208._4_4_ = fVar200 * auVar44._4_4_;
    fVar211 = auVar49._8_4_;
    auVar208._8_4_ = fVar211 * auVar44._8_4_;
    fVar212 = auVar49._12_4_;
    auVar208._12_4_ = fVar212 * auVar44._12_4_;
    auVar222._0_4_ = fVar216 * auVar45._0_4_;
    auVar222._4_4_ = fVar200 * auVar45._4_4_;
    auVar222._8_4_ = fVar211 * auVar45._8_4_;
    auVar222._12_4_ = fVar212 * auVar45._12_4_;
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar178._0_4_ = auVar51._0_4_ + auVar61._0_4_;
    auVar178._4_4_ = auVar51._4_4_ + auVar61._4_4_;
    auVar178._8_4_ = auVar51._8_4_ + auVar61._8_4_;
    auVar178._12_4_ = auVar51._12_4_ + auVar61._12_4_;
    auVar188._8_8_ = 0x3f800000;
    auVar188._0_8_ = 0x3f800000;
    auVar61 = vsubps_avx(auVar188,auVar178);
    auVar62 = vsubps_avx512vl(auVar188,auVar47);
    auVar233._0_4_ = fVar213 * auVar61._0_4_;
    auVar233._4_4_ = fVar214 * auVar61._4_4_;
    auVar233._8_4_ = fVar215 * auVar61._8_4_;
    auVar233._12_4_ = fVar159 * auVar61._12_4_;
    auVar228._0_4_ = fVar213 * auVar62._0_4_;
    auVar228._4_4_ = fVar214 * auVar62._4_4_;
    auVar228._8_4_ = fVar215 * auVar62._8_4_;
    auVar228._12_4_ = fVar159 * auVar62._12_4_;
    auVar179._0_4_ = fVar216 * auVar61._0_4_;
    auVar179._4_4_ = fVar200 * auVar61._4_4_;
    auVar179._8_4_ = fVar211 * auVar61._8_4_;
    auVar179._12_4_ = fVar212 * auVar61._12_4_;
    auVar189._0_4_ = fVar216 * auVar62._0_4_;
    auVar189._4_4_ = fVar200 * auVar62._4_4_;
    auVar189._8_4_ = fVar211 * auVar62._8_4_;
    auVar189._12_4_ = fVar212 * auVar62._12_4_;
    auVar61 = vminps_avx(auVar233,auVar228);
    auVar62 = vminps_avx512vl(auVar179,auVar189);
    auVar47 = vminps_avx512vl(auVar61,auVar62);
    auVar61 = vmaxps_avx(auVar228,auVar233);
    auVar62 = vmaxps_avx(auVar189,auVar179);
    auVar62 = vmaxps_avx(auVar62,auVar61);
    auVar44 = vminps_avx512vl(auVar240,auVar48);
    auVar61 = vminps_avx(auVar208,auVar222);
    auVar61 = vminps_avx(auVar44,auVar61);
    auVar61 = vhaddps_avx(auVar47,auVar61);
    auVar83._0_16_ = vmaxps_avx512vl(auVar48,auVar240);
    auVar47 = vmaxps_avx(auVar222,auVar208);
    auVar47 = vmaxps_avx(auVar47,auVar83._0_16_);
    auVar62 = vhaddps_avx(auVar62,auVar47);
    auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
    auVar180._0_4_ = auVar61._0_4_ + auVar50._0_4_;
    auVar180._4_4_ = auVar61._4_4_ + auVar50._4_4_;
    auVar180._8_4_ = auVar61._8_4_ + auVar50._8_4_;
    auVar180._12_4_ = auVar61._12_4_ + auVar50._12_4_;
    auVar190._0_4_ = auVar62._0_4_ + auVar50._0_4_;
    auVar190._4_4_ = auVar62._4_4_ + auVar50._4_4_;
    auVar190._8_4_ = auVar62._8_4_ + auVar50._8_4_;
    auVar190._12_4_ = auVar62._12_4_ + auVar50._12_4_;
    auVar61 = vmaxps_avx(auVar63,auVar180);
    auVar62 = vminps_avx(auVar190,auVar59);
    uVar2 = vcmpps_avx512vl(auVar62,auVar61,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar190,auVar59,1);
  uVar13 = vcmpps_avx512vl(auVar55,auVar180,1);
  if (((ushort)uVar13 & (ushort)uVar2 & 1) == 0) {
    bVar22 = 0;
  }
  else {
    auVar61 = vmovshdup_avx(auVar180);
    bVar22 = auVar52._0_4_ < auVar61._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar24 || uVar6 != 0 && !bVar35) | bVar22) != 1) goto LAB_018bbbe5;
  lVar26 = 0xc9;
  do {
    lVar26 = lVar26 + -1;
    if (lVar26 == 0) goto LAB_018bae21;
    auVar55 = vsubss_avx512f(auVar46,auVar50);
    fVar211 = auVar55._0_4_;
    fVar216 = fVar211 * fVar211 * fVar211;
    auVar55 = vmulss_avx512f(auVar50,ZEXT416(0x40400000));
    fVar200 = auVar55._0_4_ * fVar211 * fVar211;
    fVar212 = auVar50._0_4_;
    auVar55 = vmulss_avx512f(ZEXT416((uint)(fVar212 * fVar212)),ZEXT416(0x40400000));
    fVar211 = fVar211 * auVar55._0_4_;
    auVar127._4_4_ = fVar216;
    auVar127._0_4_ = fVar216;
    auVar127._8_4_ = fVar216;
    auVar127._12_4_ = fVar216;
    auVar121._4_4_ = fVar200;
    auVar121._0_4_ = fVar200;
    auVar121._8_4_ = fVar200;
    auVar121._12_4_ = fVar200;
    auVar104._4_4_ = fVar211;
    auVar104._0_4_ = fVar211;
    auVar104._8_4_ = fVar211;
    auVar104._12_4_ = fVar211;
    fVar212 = fVar212 * fVar212 * fVar212;
    auVar156._0_4_ = (float)local_f8._0_4_ * fVar212;
    auVar156._4_4_ = (float)local_f8._4_4_ * fVar212;
    auVar156._8_4_ = fStack_f0 * fVar212;
    auVar156._12_4_ = fStack_ec * fVar212;
    auVar55 = vfmadd231ps_fma(auVar156,local_278,auVar104);
    auVar55 = vfmadd231ps_fma(auVar55,local_328,auVar121);
    auVar55 = vfmadd231ps_fma(auVar55,_local_318,auVar127);
    auVar105._8_8_ = auVar55._0_8_;
    auVar105._0_8_ = auVar55._0_8_;
    auVar55 = vshufpd_avx(auVar55,auVar55,3);
    auVar61 = vshufps_avx(auVar50,auVar50,0x55);
    auVar55 = vsubps_avx(auVar55,auVar105);
    auVar61 = vfmadd213ps_fma(auVar55,auVar61,auVar105);
    fVar216 = auVar61._0_4_;
    auVar55 = vshufps_avx(auVar61,auVar61,0x55);
    auVar106._0_4_ = auVar54._0_4_ * fVar216 + auVar37._0_4_ * auVar55._0_4_;
    auVar106._4_4_ = auVar54._4_4_ * fVar216 + auVar37._4_4_ * auVar55._4_4_;
    auVar106._8_4_ = auVar54._8_4_ * fVar216 + auVar37._8_4_ * auVar55._8_4_;
    auVar106._12_4_ = auVar54._12_4_ * fVar216 + auVar37._12_4_ * auVar55._12_4_;
    auVar50 = vsubps_avx(auVar50,auVar106);
    auVar55 = vandps_avx512vl(auVar61,auVar246._0_16_);
    auVar83._0_16_ = vprolq_avx512vl(auVar55,0x20);
    auVar55 = vmaxss_avx(auVar83._0_16_,auVar55);
    bVar35 = (float)local_108._0_4_ < auVar55._0_4_;
  } while ((float)local_108._0_4_ <= auVar55._0_4_);
  auVar55 = vucomiss_avx512f(auVar60);
  if (bVar35) goto LAB_018bae21;
  auVar54 = vucomiss_avx512f(auVar55);
  auVar248 = ZEXT1664(auVar54);
  if (bVar35) goto LAB_018bae21;
  vmovshdup_avx(auVar55);
  auVar54 = vucomiss_avx512f(auVar60);
  if (bVar35) goto LAB_018bae21;
  auVar61 = vucomiss_avx512f(auVar54);
  auVar248 = ZEXT1664(auVar61);
  if (bVar35) goto LAB_018bae21;
  auVar62 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar49 = vinsertps_avx(auVar62,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar3 = (ray->org).field_0;
  auVar62 = vsubps_avx(local_1a8,(undefined1  [16])aVar3);
  auVar62 = vdpps_avx(auVar62,auVar49,0x7f);
  auVar63 = vsubps_avx(local_1b8,(undefined1  [16])aVar3);
  auVar63 = vdpps_avx(auVar63,auVar49,0x7f);
  auVar47 = vsubps_avx(local_1c8,(undefined1  [16])aVar3);
  auVar47 = vdpps_avx(auVar47,auVar49,0x7f);
  auVar44 = vsubps_avx(local_1d8,(undefined1  [16])aVar3);
  auVar44 = vdpps_avx(auVar44,auVar49,0x7f);
  auVar45 = vsubps_avx(_local_1e8,(undefined1  [16])aVar3);
  auVar45 = vdpps_avx(auVar45,auVar49,0x7f);
  auVar46 = vsubps_avx(_local_1f8,(undefined1  [16])aVar3);
  auVar46 = vdpps_avx(auVar46,auVar49,0x7f);
  auVar48 = vsubps_avx(_local_208,(undefined1  [16])aVar3);
  auVar48 = vdpps_avx(auVar48,auVar49,0x7f);
  auVar50 = vsubps_avx(_local_218,(undefined1  [16])aVar3);
  auVar49 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar50 = vsubss_avx512f(auVar61,auVar54);
  fVar216 = auVar54._0_4_;
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar216)),auVar50,auVar62);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar216)),auVar50,auVar63);
  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * fVar216)),auVar50,auVar47);
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar49._0_4_)),auVar50,auVar44);
  auVar61 = vsubss_avx512f(auVar61,auVar55);
  auVar157._0_4_ = auVar61._0_4_;
  fVar200 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  auVar61 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
  fVar211 = auVar61._0_4_ * auVar157._0_4_ * auVar157._0_4_;
  fVar216 = auVar55._0_4_;
  auVar140._0_4_ = fVar216 * fVar216;
  auVar140._4_4_ = auVar55._4_4_ * auVar55._4_4_;
  auVar140._8_4_ = auVar55._8_4_ * auVar55._8_4_;
  auVar140._12_4_ = auVar55._12_4_ * auVar55._12_4_;
  auVar83._0_16_ = vmulss_avx512f(auVar140,ZEXT416(0x40400000));
  fVar212 = auVar157._0_4_ * auVar83._0_4_;
  fVar214 = fVar216 * auVar140._0_4_;
  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar47._0_4_)),ZEXT416((uint)fVar212),auVar63)
  ;
  auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar211),auVar62);
  auVar54 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar200),auVar54);
  fVar213 = auVar54._0_4_;
  if ((fVar213 < (ray->org).field_0.m128[3]) || (fVar215 = ray->tfar, fVar215 < fVar213))
  goto LAB_018bae21;
  auVar54 = vshufps_avx(auVar55,auVar55,0x55);
  auVar62 = vsubps_avx512vl(auVar57,auVar54);
  fVar159 = auVar54._0_4_;
  auVar191._0_4_ = fVar159 * (float)local_1e8._0_4_;
  fVar168 = auVar54._4_4_;
  auVar191._4_4_ = fVar168 * (float)local_1e8._4_4_;
  fVar169 = auVar54._8_4_;
  auVar191._8_4_ = fVar169 * fStack_1e0;
  fVar170 = auVar54._12_4_;
  auVar191._12_4_ = fVar170 * fStack_1dc;
  auVar197._0_4_ = fVar159 * (float)local_1f8._0_4_;
  auVar197._4_4_ = fVar168 * (float)local_1f8._4_4_;
  auVar197._8_4_ = fVar169 * fStack_1f0;
  auVar197._12_4_ = fVar170 * fStack_1ec;
  auVar209._0_4_ = fVar159 * (float)local_208._0_4_;
  auVar209._4_4_ = fVar168 * (float)local_208._4_4_;
  auVar209._8_4_ = fVar169 * fStack_200;
  auVar209._12_4_ = fVar170 * fStack_1fc;
  auVar165._0_4_ = fVar159 * (float)local_218._0_4_;
  auVar165._4_4_ = fVar168 * (float)local_218._4_4_;
  auVar165._8_4_ = fVar169 * fStack_210;
  auVar165._12_4_ = fVar170 * fStack_20c;
  auVar57 = vfmadd231ps_fma(auVar191,auVar62,local_1a8);
  auVar54 = vfmadd231ps_fma(auVar197,auVar62,local_1b8);
  auVar61 = vfmadd231ps_fma(auVar209,auVar62,local_1c8);
  auVar62 = vfmadd231ps_fma(auVar165,auVar62,local_1d8);
  auVar57 = vsubps_avx(auVar54,auVar57);
  auVar54 = vsubps_avx(auVar61,auVar54);
  auVar61 = vsubps_avx(auVar62,auVar61);
  auVar210._0_4_ = fVar216 * auVar54._0_4_;
  auVar210._4_4_ = fVar216 * auVar54._4_4_;
  auVar210._8_4_ = fVar216 * auVar54._8_4_;
  auVar210._12_4_ = fVar216 * auVar54._12_4_;
  auVar157._4_4_ = auVar157._0_4_;
  auVar157._8_4_ = auVar157._0_4_;
  auVar157._12_4_ = auVar157._0_4_;
  auVar57 = vfmadd231ps_fma(auVar210,auVar157,auVar57);
  auVar166._0_4_ = fVar216 * auVar61._0_4_;
  auVar166._4_4_ = fVar216 * auVar61._4_4_;
  auVar166._8_4_ = fVar216 * auVar61._8_4_;
  auVar166._12_4_ = fVar216 * auVar61._12_4_;
  auVar54 = vfmadd231ps_fma(auVar166,auVar157,auVar54);
  auVar167._0_4_ = fVar216 * auVar54._0_4_;
  auVar167._4_4_ = fVar216 * auVar54._4_4_;
  auVar167._8_4_ = fVar216 * auVar54._8_4_;
  auVar167._12_4_ = fVar216 * auVar54._12_4_;
  auVar57 = vfmadd231ps_fma(auVar167,auVar157,auVar57);
  auVar83._0_16_ = vmulps_avx512vl(auVar57,auVar53);
  pGVar7 = (context->scene->geometries).items[local_300].ptr;
  if ((pGVar7->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar22 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018bbbdd;
    auVar141._0_4_ = fVar214 * (float)local_158._0_4_;
    auVar141._4_4_ = fVar214 * (float)local_158._4_4_;
    auVar141._8_4_ = fVar214 * fStack_150;
    auVar141._12_4_ = fVar214 * fStack_14c;
    auVar128._4_4_ = fVar212;
    auVar128._0_4_ = fVar212;
    auVar128._8_4_ = fVar212;
    auVar128._12_4_ = fVar212;
    auVar53 = vfmadd132ps_fma(auVar128,auVar141,local_148);
    auVar122._4_4_ = fVar211;
    auVar122._0_4_ = fVar211;
    auVar122._8_4_ = fVar211;
    auVar122._12_4_ = fVar211;
    auVar53 = vfmadd132ps_fma(auVar122,auVar53,local_138);
    auVar116._4_4_ = fVar200;
    auVar116._0_4_ = fVar200;
    auVar116._8_4_ = fVar200;
    auVar116._12_4_ = fVar200;
    auVar54 = vfmadd132ps_fma(auVar116,auVar53,local_128);
    auVar53 = vshufps_avx(auVar54,auVar54,0xc9);
    auVar57 = vshufps_avx(auVar83._0_16_,auVar83._0_16_,0xc9);
    auVar117._0_4_ = auVar54._0_4_ * auVar57._0_4_;
    auVar117._4_4_ = auVar54._4_4_ * auVar57._4_4_;
    auVar117._8_4_ = auVar54._8_4_ * auVar57._8_4_;
    auVar117._12_4_ = auVar54._12_4_ * auVar57._12_4_;
    auVar57 = vfmsub231ps_fma(auVar117,auVar83._0_16_,auVar53);
    auVar53 = vshufps_avx(auVar57,auVar57,0xe9);
    local_188 = vmovlps_avx(auVar53);
    local_180 = auVar57._0_4_;
    local_17c = vmovlps_avx(auVar55);
    local_174 = (int)local_258;
    local_170 = (int)local_300;
    local_16c = context->user->instID[0];
    local_168 = context->user->instPrimID[0];
    ray->tfar = fVar213;
    local_32c = -1;
    local_248.valid = &local_32c;
    local_248.geometryUserPtr = pGVar7->userPtr;
    local_248.context = context->user;
    local_248.hit = (RTCHitN *)&local_188;
    local_248.N = 1;
    local_248.ray = (RTCRayN *)ray;
    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018bbb09:
      auVar55 = auVar249._0_16_;
      p_Var12 = context->args->filter;
      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var12)(&local_248);
        auVar243 = ZEXT3264(_DAT_01fb9fe0);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar242 = ZEXT1664(auVar53);
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar241 = ZEXT3264(auVar83);
        auVar248 = ZEXT464(0x3f800000);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar245 = ZEXT1664(auVar53);
        auVar55 = vxorps_avx512vl(auVar55,auVar55);
        auVar249 = ZEXT1664(auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar247 = ZEXT1664(auVar55);
        auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar246 = ZEXT1664(auVar83._0_16_);
        if (*local_248.valid == 0) goto LAB_018bbbcf;
      }
      bVar22 = 1;
      goto LAB_018bbbdd;
    }
    local_260 = lVar28;
    (*pGVar7->occlusionFilterN)(&local_248);
    auVar243 = ZEXT3264(_DAT_01fb9fe0);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar242 = ZEXT1664(auVar55);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar241 = ZEXT3264(auVar83);
    auVar248 = ZEXT464(0x3f800000);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT1664(auVar55);
    auVar55 = vxorps_avx512vl(auVar60,auVar60);
    auVar249 = ZEXT1664(auVar55);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar247 = ZEXT1664(auVar55);
    auVar83._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar246 = ZEXT1664(auVar83._0_16_);
    lVar28 = local_260;
    if (*local_248.valid != 0) goto LAB_018bbb09;
LAB_018bbbcf:
    auVar248 = ZEXT464(0x3f800000);
    ray->tfar = fVar215;
  }
  bVar22 = 0;
LAB_018bbbdd:
  bVar32 = (bool)(bVar32 | bVar22);
  goto LAB_018bae21;
LAB_018bbbe5:
  auVar39 = vinsertps_avx(auVar52,auVar58,0x10);
  goto LAB_018ba923;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }